

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 (*pauVar1) [16];
  undefined4 uVar2;
  undefined1 auVar3 [32];
  uint uVar4;
  pointer pMVar5;
  Mat *this_00;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  __m256 *pafVar33;
  int y;
  uint uVar34;
  long lVar35;
  int iVar36;
  Mat *pMVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  int z;
  int iVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [32];
  __m256 *pafVar44;
  uint uVar45;
  float *pfVar46;
  undefined1 (*pauVar47) [32];
  ulong uVar48;
  undefined4 *puVar49;
  undefined1 (*pauVar50) [32];
  undefined8 *puVar51;
  float *pfVar52;
  undefined1 (*pauVar53) [32];
  float *pfVar54;
  undefined1 (*pauVar55) [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar56;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined8 uVar117;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined8 uVar118;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  __m256 afVar90;
  undefined1 auVar116 [56];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar141 [64];
  float in_register_000012dc;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float in_register_0000131c;
  __m128 afVar149;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 op_4;
  __m256 _b_avx;
  Mat *local_170;
  float *local_168;
  Mat *local_160;
  binary_op_ratan2 local_141;
  undefined1 local_140 [16];
  float *local_128;
  void *local_120;
  float *local_118;
  ulong local_110;
  size_t local_108;
  __m256 local_100;
  binary_op_ratan2 local_d0 [8];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined1 local_a0 [16];
  float afStack_90 [2];
  float afStack_88 [2];
  undefined1 local_80 [32];
  
  local_140._8_8_ = local_140._0_8_;
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_160 = pMVar5 + 1;
  iVar36 = pMVar5[1].h * pMVar5[1].w * pMVar5[1].d * pMVar5[1].c * pMVar5[1].elempack;
  if (((pMVar5->dims < pMVar5[1].dims) && (iVar36 != 1)) ||
     (pMVar5->c * pMVar5->elempack * pMVar5->d * pMVar5->h * pMVar5->w < iVar36)) {
    uVar32 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3]);
    switch(uVar32) {
    case 1:
      uVar32 = 7;
      break;
    case 3:
      uVar32 = 8;
      break;
    case 6:
      uVar32 = 9;
      break;
    case 7:
      uVar32 = 1;
      break;
    case 8:
      uVar32 = 3;
      break;
    case 9:
      uVar32 = 6;
      break;
    case 10:
      uVar32 = 0xb;
      break;
    case 0xb:
      uVar32 = 10;
    }
    local_170 = local_160;
    local_160 = pMVar5;
  }
  else {
    uVar32 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3]);
    local_170 = pMVar5;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,local_170,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  iVar36 = local_160->elempack;
  uVar34 = local_160->w;
  local_140._0_8_ = ZEXT48(uVar34);
  iVar41 = local_160->h;
  iVar27 = local_160->d;
  iVar26 = iVar41 * uVar34 * iVar27;
  uVar45 = local_160->c;
  if (uVar45 * iVar36 * iVar26 != 1) {
    uVar30 = local_170->dims;
    uVar4 = local_160->dims;
    if ((((uVar30 != uVar4) || (local_170->w != uVar34)) ||
        ((local_170->h != iVar41 || ((local_170->d != iVar27 || (local_170->c != uVar45)))))) ||
       (local_170->elempack != iVar36)) {
      if ((int)uVar4 < (int)uVar30) {
LAB_0036afc2:
        binary_op_broadcast_inner(local_170,local_160,this_00,uVar32,(Option *)(ulong)uVar4);
        goto switchD_0036aedd_default;
      }
      if (uVar30 == 2) {
        if ((uVar34 == 1) && (iVar41 == local_170->h)) goto LAB_0036afc2;
LAB_0036b052:
        bVar25 = false;
LAB_0036b055:
        bVar24 = false;
      }
      else {
        if (uVar30 == 4) {
          bVar25 = true;
          if ((uVar34 == 1) &&
             (((iVar41 == 1 &&
               (((iVar27 == 1 && (uVar45 == local_170->c)) ||
                ((iVar27 == local_170->d && (uVar45 == local_170->c)))))) ||
              (((iVar41 == local_170->h && (iVar27 == local_170->d)) && (uVar45 == local_170->c)))))
             ) goto LAB_0036afc2;
          goto LAB_0036b055;
        }
        if (uVar30 != 3) goto LAB_0036b052;
        bVar24 = true;
        if ((uVar34 == 1) &&
           (((iVar41 == 1 && (uVar45 == local_170->c)) ||
            ((iVar41 == local_170->h && (uVar45 == local_170->c)))))) goto LAB_0036afc2;
        bVar25 = false;
      }
      if ((iVar36 == 1) &&
         (((((uVar30 == 2 && (iVar41 == 1)) && (uVar34 == local_170->w)) ||
           ((bVar24 &&
            ((((uVar45 == 1 && (iVar41 == 1)) && (uVar34 == local_170->w)) ||
             (((uVar34 == local_170->w && (uVar45 == 1)) && (iVar41 == local_170->h)))))))) ||
          ((bVar25 &&
           (((((uVar45 == 1 && (iVar27 == 1)) && (iVar41 == 1)) && (uVar34 == local_170->w)) ||
            ((uVar34 == local_170->w &&
             ((((uVar45 == 1 && (iVar27 == 1)) && (iVar41 == local_170->h)) ||
              (((iVar41 == local_170->h && (uVar45 == 1)) && (iVar27 == local_170->d)))))))))))))) {
        switch(uVar32) {
        case 0:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pfVar52 = (float *)((long)local_170->w * uVar31 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  fVar56 = *pfVar46;
                  auVar88._0_4_ = fVar56 + *pfVar52;
                  auVar88._4_4_ = fVar56 + pfVar52[1];
                  auVar88._8_4_ = fVar56 + pfVar52[2];
                  auVar88._12_4_ = fVar56 + pfVar52[3];
                  auVar88._16_4_ = fVar56 + pfVar52[4];
                  auVar88._20_4_ = fVar56 + pfVar52[5];
                  auVar88._24_4_ = fVar56 + pfVar52[6];
                  auVar88._28_4_ = fVar56 + pfVar52[7];
                  *pauVar47 = auVar88;
                  pfVar52 = pfVar52 + 8;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  fVar56 = *pfVar46;
                  auVar58._0_4_ = fVar56 + *pfVar52;
                  auVar58._4_4_ = fVar56 + pfVar52[1];
                  auVar58._8_4_ = fVar56 + pfVar52[2];
                  auVar58._12_4_ = fVar56 + pfVar52[3];
                  *(undefined1 (*) [16])*pauVar47 = auVar58;
                  pfVar52 = pfVar52 + 4;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar46[lVar35] + pfVar52[lVar35];
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar52 = (float *)((long)local_160->data +
                                   (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35
                                   );
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    fVar56 = *pfVar52;
                    auVar97._0_4_ = fVar56 + *pfVar46;
                    auVar97._4_4_ = fVar56 + pfVar46[1];
                    auVar97._8_4_ = fVar56 + pfVar46[2];
                    auVar97._12_4_ = fVar56 + pfVar46[3];
                    auVar97._16_4_ = fVar56 + pfVar46[4];
                    auVar97._20_4_ = fVar56 + pfVar46[5];
                    auVar97._24_4_ = fVar56 + pfVar46[6];
                    auVar97._28_4_ = fVar56 + pfVar46[7];
                    *pauVar47 = auVar97;
                    pfVar46 = pfVar46 + 8;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    fVar56 = *pfVar52;
                    auVar76._0_4_ = fVar56 + *pfVar46;
                    auVar76._4_4_ = fVar56 + pfVar46[1];
                    auVar76._8_4_ = fVar56 + pfVar46[2];
                    auVar76._12_4_ = fVar56 + pfVar46[3];
                    *(undefined1 (*) [16])*pauVar47 = auVar76;
                    pfVar46 = pfVar46 + 4;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar52[lVar35] + pfVar46[lVar35];
                    lVar28 = lVar28 + -4;
                  }
                  pfVar46 = (float *)((long)pfVar46 - lVar28);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                }
              }
            }
          }
          return 0;
        case 1:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar31 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar53 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              puVar49 = (undefined4 *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar129._4_4_ = uVar2;
                  auVar129._0_4_ = uVar2;
                  auVar129._8_4_ = uVar2;
                  auVar129._12_4_ = uVar2;
                  auVar129._16_4_ = uVar2;
                  auVar129._20_4_ = uVar2;
                  auVar129._24_4_ = uVar2;
                  auVar129._28_4_ = uVar2;
                  auVar3 = vsubps_avx(*pauVar47,auVar129);
                  *pauVar53 = auVar3;
                  pauVar47 = pauVar47 + 1;
                  puVar49 = puVar49 + 1;
                  pauVar53 = pauVar53 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar120._4_4_ = uVar2;
                  auVar120._0_4_ = uVar2;
                  auVar120._8_4_ = uVar2;
                  auVar120._12_4_ = uVar2;
                  auVar86 = vsubps_avx(*(undefined1 (*) [16])*pauVar47,auVar120);
                  *(undefined1 (*) [16])*pauVar53 = auVar86;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                  puVar49 = puVar49 + 1;
                  pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar53 + lVar35 * 4) =
                       *(float *)(*pauVar47 + lVar35 * 4) - (float)puVar49[lVar35];
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                puVar49 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35);
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar130._4_4_ = uVar2;
                    auVar130._0_4_ = uVar2;
                    auVar130._8_4_ = uVar2;
                    auVar130._12_4_ = uVar2;
                    auVar130._16_4_ = uVar2;
                    auVar130._20_4_ = uVar2;
                    auVar130._24_4_ = uVar2;
                    auVar130._28_4_ = uVar2;
                    auVar3 = vsubps_avx(*pauVar47,auVar130);
                    *pauVar53 = auVar3;
                    pauVar47 = pauVar47 + 1;
                    puVar49 = puVar49 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar122._4_4_ = uVar2;
                    auVar122._0_4_ = uVar2;
                    auVar122._8_4_ = uVar2;
                    auVar122._12_4_ = uVar2;
                    auVar86 = vsubps_avx(*(undefined1 (*) [16])*pauVar47,auVar122);
                    *(undefined1 (*) [16])*pauVar53 = auVar86;
                    pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                    puVar49 = puVar49 + 1;
                    pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar53 + lVar35 * 4) =
                         *(float *)(*pauVar47 + lVar35 * 4) - (float)puVar49[lVar35];
                    lVar28 = lVar28 + -4;
                  }
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                  pauVar53 = (undefined1 (*) [32])((long)pauVar53 - lVar28);
                }
              }
            }
          }
          return 0;
        case 2:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pfVar52 = (float *)((long)local_170->w * uVar31 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  fVar56 = *pfVar46;
                  auVar15._4_4_ = fVar56 * pfVar52[1];
                  auVar15._0_4_ = fVar56 * *pfVar52;
                  auVar15._8_4_ = fVar56 * pfVar52[2];
                  auVar15._12_4_ = fVar56 * pfVar52[3];
                  auVar15._16_4_ = fVar56 * pfVar52[4];
                  auVar15._20_4_ = fVar56 * pfVar52[5];
                  auVar15._24_4_ = fVar56 * pfVar52[6];
                  auVar15._28_4_ = fVar56;
                  *pauVar47 = auVar15;
                  pfVar52 = pfVar52 + 8;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  fVar56 = *pfVar46;
                  auVar64._0_4_ = fVar56 * *pfVar52;
                  auVar64._4_4_ = fVar56 * pfVar52[1];
                  auVar64._8_4_ = fVar56 * pfVar52[2];
                  auVar64._12_4_ = fVar56 * pfVar52[3];
                  *(undefined1 (*) [16])*pauVar47 = auVar64;
                  pfVar52 = pfVar52 + 4;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar46[lVar35] * pfVar52[lVar35];
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar52 = (float *)((long)local_160->data +
                                   (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35
                                   );
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    fVar56 = *pfVar52;
                    auVar17._4_4_ = fVar56 * pfVar46[1];
                    auVar17._0_4_ = fVar56 * *pfVar46;
                    auVar17._8_4_ = fVar56 * pfVar46[2];
                    auVar17._12_4_ = fVar56 * pfVar46[3];
                    auVar17._16_4_ = fVar56 * pfVar46[4];
                    auVar17._20_4_ = fVar56 * pfVar46[5];
                    auVar17._24_4_ = fVar56 * pfVar46[6];
                    auVar17._28_4_ = fVar56;
                    *pauVar47 = auVar17;
                    pfVar46 = pfVar46 + 8;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    fVar56 = *pfVar52;
                    auVar74._0_4_ = fVar56 * *pfVar46;
                    auVar74._4_4_ = fVar56 * pfVar46[1];
                    auVar74._8_4_ = fVar56 * pfVar46[2];
                    auVar74._12_4_ = fVar56 * pfVar46[3];
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pfVar46 = pfVar46 + 4;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar52[lVar35] * pfVar46[lVar35];
                    lVar28 = lVar28 + -4;
                  }
                  pfVar46 = (float *)((long)pfVar46 - lVar28);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                }
              }
            }
          }
          return 0;
        case 3:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pfVar52 = (float *)((long)local_170->w * uVar31 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  auVar86 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar46)),
                                        ZEXT416((uint)(1.0 / *pfVar46)),0);
                  auVar16._4_4_ = auVar86._4_4_ * pfVar52[1];
                  auVar16._0_4_ = auVar86._0_4_ * *pfVar52;
                  auVar16._8_4_ = auVar86._8_4_ * pfVar52[2];
                  auVar16._12_4_ = auVar86._12_4_ * pfVar52[3];
                  auVar16._16_4_ = auVar86._0_4_ * pfVar52[4];
                  auVar16._20_4_ = auVar86._4_4_ * pfVar52[5];
                  auVar16._24_4_ = auVar86._8_4_ * pfVar52[6];
                  auVar16._28_4_ = auVar86._12_4_;
                  *pauVar47 = auVar16;
                  pfVar52 = pfVar52 + 8;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  auVar86 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar46)),
                                        ZEXT416((uint)(1.0 / *pfVar46)),0);
                  auVar119._0_4_ = auVar86._0_4_ * *pfVar52;
                  auVar119._4_4_ = auVar86._4_4_ * pfVar52[1];
                  auVar119._8_4_ = auVar86._8_4_ * pfVar52[2];
                  auVar119._12_4_ = auVar86._12_4_ * pfVar52[3];
                  *(undefined1 (*) [16])*pauVar47 = auVar119;
                  pfVar52 = pfVar52 + 4;
                  pfVar46 = pfVar46 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar52[lVar35] / pfVar46[lVar35];
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar52 = (float *)((long)local_160->data +
                                   (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35
                                   );
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    auVar86 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar52)),
                                          ZEXT416((uint)(1.0 / *pfVar52)),0);
                    auVar18._4_4_ = auVar86._4_4_ * pfVar46[1];
                    auVar18._0_4_ = auVar86._0_4_ * *pfVar46;
                    auVar18._8_4_ = auVar86._8_4_ * pfVar46[2];
                    auVar18._12_4_ = auVar86._12_4_ * pfVar46[3];
                    auVar18._16_4_ = auVar86._0_4_ * pfVar46[4];
                    auVar18._20_4_ = auVar86._4_4_ * pfVar46[5];
                    auVar18._24_4_ = auVar86._8_4_ * pfVar46[6];
                    auVar18._28_4_ = auVar86._12_4_;
                    *pauVar47 = auVar18;
                    pfVar46 = pfVar46 + 8;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    auVar86 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar52)),
                                          ZEXT416((uint)(1.0 / *pfVar52)),0);
                    auVar121._0_4_ = auVar86._0_4_ * *pfVar46;
                    auVar121._4_4_ = auVar86._4_4_ * pfVar46[1];
                    auVar121._8_4_ = auVar86._8_4_ * pfVar46[2];
                    auVar121._12_4_ = auVar86._12_4_ * pfVar46[3];
                    *(undefined1 (*) [16])*pauVar47 = auVar121;
                    pfVar46 = pfVar46 + 4;
                    pfVar52 = pfVar52 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar47 + lVar35 * 4) = pfVar46[lVar35] / pfVar52[lVar35];
                    lVar28 = lVar28 + -4;
                  }
                  pfVar46 = (float *)((long)pfVar46 - lVar28);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                }
              }
            }
          }
          return 0;
        case 4:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar31 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar53 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              puVar49 = (undefined4 *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar91._4_4_ = uVar2;
                  auVar91._0_4_ = uVar2;
                  auVar91._8_4_ = uVar2;
                  auVar91._12_4_ = uVar2;
                  auVar91._16_4_ = uVar2;
                  auVar91._20_4_ = uVar2;
                  auVar91._24_4_ = uVar2;
                  auVar91._28_4_ = uVar2;
                  auVar3 = vmaxps_avx(auVar91,*pauVar47);
                  *pauVar53 = auVar3;
                  pauVar47 = pauVar47 + 1;
                  puVar49 = puVar49 + 1;
                  pauVar53 = pauVar53 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar62._4_4_ = uVar2;
                  auVar62._0_4_ = uVar2;
                  auVar62._8_4_ = uVar2;
                  auVar62._12_4_ = uVar2;
                  auVar86 = vmaxps_avx(auVar62,*(undefined1 (*) [16])*pauVar47);
                  *(undefined1 (*) [16])*pauVar53 = auVar86;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                  puVar49 = puVar49 + 1;
                  pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  auVar86 = vmaxss_avx(ZEXT416((uint)puVar49[lVar35]),
                                       ZEXT416(*(uint *)(*pauVar47 + lVar35 * 4)));
                  *(int *)((long)*pauVar53 + lVar35 * 4) = auVar86._0_4_;
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                puVar49 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35);
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar95._4_4_ = uVar2;
                    auVar95._0_4_ = uVar2;
                    auVar95._8_4_ = uVar2;
                    auVar95._12_4_ = uVar2;
                    auVar95._16_4_ = uVar2;
                    auVar95._20_4_ = uVar2;
                    auVar95._24_4_ = uVar2;
                    auVar95._28_4_ = uVar2;
                    auVar3 = vmaxps_avx(auVar95,*pauVar47);
                    *pauVar53 = auVar3;
                    pauVar47 = pauVar47 + 1;
                    puVar49 = puVar49 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar72._4_4_ = uVar2;
                    auVar72._0_4_ = uVar2;
                    auVar72._8_4_ = uVar2;
                    auVar72._12_4_ = uVar2;
                    auVar86 = vmaxps_avx(auVar72,*(undefined1 (*) [16])*pauVar47);
                    *(undefined1 (*) [16])*pauVar53 = auVar86;
                    pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                    puVar49 = puVar49 + 1;
                    pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    auVar86 = vmaxss_avx(ZEXT416((uint)puVar49[lVar35]),
                                         ZEXT416(*(uint *)(*pauVar47 + lVar35 * 4)));
                    *(int *)((long)*pauVar53 + lVar35 * 4) = auVar86._0_4_;
                    lVar28 = lVar28 + -4;
                  }
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                  pauVar53 = (undefined1 (*) [32])((long)pauVar53 - lVar28);
                }
              }
            }
          }
          return 0;
        case 5:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar31 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar53 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              puVar49 = (undefined4 *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar93._4_4_ = uVar2;
                  auVar93._0_4_ = uVar2;
                  auVar93._8_4_ = uVar2;
                  auVar93._12_4_ = uVar2;
                  auVar93._16_4_ = uVar2;
                  auVar93._20_4_ = uVar2;
                  auVar93._24_4_ = uVar2;
                  auVar93._28_4_ = uVar2;
                  auVar3 = vminps_avx(auVar93,*pauVar47);
                  *pauVar53 = auVar3;
                  pauVar47 = pauVar47 + 1;
                  puVar49 = puVar49 + 1;
                  pauVar53 = pauVar53 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar66._4_4_ = uVar2;
                  auVar66._0_4_ = uVar2;
                  auVar66._8_4_ = uVar2;
                  auVar66._12_4_ = uVar2;
                  auVar86 = vminps_avx(auVar66,*(undefined1 (*) [16])*pauVar47);
                  *(undefined1 (*) [16])*pauVar53 = auVar86;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                  puVar49 = puVar49 + 1;
                  pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  auVar86 = vminss_avx(ZEXT416((uint)puVar49[lVar35]),
                                       ZEXT416(*(uint *)(*pauVar47 + lVar35 * 4)));
                  *(int *)((long)*pauVar53 + lVar35 * 4) = auVar86._0_4_;
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                puVar49 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35);
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar98._4_4_ = uVar2;
                    auVar98._0_4_ = uVar2;
                    auVar98._8_4_ = uVar2;
                    auVar98._12_4_ = uVar2;
                    auVar98._16_4_ = uVar2;
                    auVar98._20_4_ = uVar2;
                    auVar98._24_4_ = uVar2;
                    auVar98._28_4_ = uVar2;
                    auVar3 = vminps_avx(auVar98,*pauVar47);
                    *pauVar53 = auVar3;
                    pauVar47 = pauVar47 + 1;
                    puVar49 = puVar49 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar77._4_4_ = uVar2;
                    auVar77._0_4_ = uVar2;
                    auVar77._8_4_ = uVar2;
                    auVar77._12_4_ = uVar2;
                    auVar86 = vminps_avx(auVar77,*(undefined1 (*) [16])*pauVar47);
                    *(undefined1 (*) [16])*pauVar53 = auVar86;
                    pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                    puVar49 = puVar49 + 1;
                    pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    auVar86 = vminss_avx(ZEXT416((uint)puVar49[lVar35]),
                                         ZEXT416(*(uint *)(*pauVar47 + lVar35 * 4)));
                    *(int *)((long)*pauVar53 + lVar35 * 4) = auVar86._0_4_;
                    lVar28 = lVar28 + -4;
                  }
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                  pauVar53 = (undefined1 (*) [32])((long)pauVar53 - lVar28);
                }
              }
            }
          }
          return 0;
        case 6:
          iVar36 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            local_118 = (float *)0x0;
            if (0 < (int)(uint)local_120) {
              local_118 = (float *)(ulong)(uint)local_120;
            }
            while ((float *)uVar31 != local_118) {
              pfVar54 = (float *)((long)local_170->w * uVar31 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar52 = (float *)((long)this_00->w * uVar31 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar39 = uVar42;
              local_128 = (float *)uVar31;
              if (iVar36 == 8) {
                while ((int)uVar39 != 0) {
                  local_c0 = *(float (*) [2])pfVar54;
                  afStack_b8 = *(float (*) [2])(pfVar54 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar54 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar54 + 6);
                  fVar56 = *pfVar46;
                  local_100[1] = fVar56;
                  local_100[0] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  local_100[4] = fVar56;
                  local_100[5] = fVar56;
                  local_100[6] = fVar56;
                  local_100[7] = fVar56;
                  afVar90 = local_100;
                  BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                            ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar52 = afVar90;
                  pfVar54 = pfVar54 + 8;
                  pfVar46 = pfVar46 + 1;
                  pfVar52 = pfVar52 + 8;
                  uVar39 = (ulong)((int)uVar39 - 1);
                }
              }
              uVar31 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar31 != 0) {
                  local_c0 = *(float (*) [2])pfVar54;
                  afStack_b8 = *(float (*) [2])(pfVar54 + 2);
                  fVar56 = *pfVar46;
                  auVar67._4_4_ = fVar56;
                  auVar67._0_4_ = fVar56;
                  auVar67._8_4_ = fVar56;
                  auVar67._12_4_ = fVar56;
                  local_100[0] = fVar56;
                  local_100[1] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  auVar116 = ZEXT856(auVar67._8_8_);
                  afVar149 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                       ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar104._0_8_ = afVar149._0_8_;
                  auVar104._8_56_ = auVar116;
                  *(undefined1 (*) [16])pfVar52 = auVar104._0_16_;
                  pfVar54 = pfVar54 + 4;
                  pfVar46 = pfVar46 + 1;
                  pfVar52 = pfVar52 + 4;
                  uVar31 = (ulong)((int)uVar31 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  fVar56 = powf(pfVar54[lVar35],pfVar46[lVar35]);
                  (*(__m256 *)pfVar52)[lVar35] = fVar56;
                }
              }
              uVar31 = (long)local_128 + 1;
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          uVar31 = 0;
          uVar42 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar42 = uVar31;
          }
          local_140._0_8_ = uVar42;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar42 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar42 = 0;
          }
          local_a0._0_8_ = uVar42;
          while (uVar31 != local_a0._0_8_) {
            pfVar52 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar31;
            pfVar46 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            iVar41 = 0;
            while (iVar41 != (uint)local_110) {
              iVar27 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar41);
              if (iVar41 <= iVar27) {
                iVar27 = iVar41;
              }
              local_118 = (float *)(long)iVar27;
              iVar41 = 0;
              while (iVar41 != (uint)local_120) {
                iVar27 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar41);
                if (iVar41 <= iVar27) {
                  iVar27 = iVar41;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar54 = (float *)((long)local_160->data +
                                   iVar27 * lVar35 + (long)local_160->h * (long)local_118 * lVar35);
                if (iVar36 == 8) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar52;
                    afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar52 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar52 + 6);
                    fVar56 = *pfVar54;
                    local_100[1] = fVar56;
                    local_100[0] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    local_100[4] = fVar56;
                    local_100[5] = fVar56;
                    local_100[6] = fVar56;
                    local_100[7] = fVar56;
                    afVar90 = local_100;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar46 = afVar90;
                    pfVar52 = pfVar52 + 8;
                    pfVar54 = pfVar54 + 1;
                    pfVar46 = pfVar46 + 8;
                  }
                }
                if (iVar36 == 4) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar52;
                    afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                    fVar56 = *pfVar54;
                    auVar78._4_4_ = fVar56;
                    auVar78._0_4_ = fVar56;
                    auVar78._8_4_ = fVar56;
                    auVar78._12_4_ = fVar56;
                    local_100[0] = fVar56;
                    local_100[1] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    auVar116 = ZEXT856(auVar78._8_8_);
                    afVar149 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                         ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar108._0_8_ = afVar149._0_8_;
                    auVar108._8_56_ = auVar116;
                    *(undefined1 (*) [16])pfVar46 = auVar108._0_16_;
                    pfVar52 = pfVar52 + 4;
                    pfVar54 = pfVar54 + 1;
                    pfVar46 = pfVar46 + 4;
                  }
                }
                if (iVar36 == 1) {
                  lVar35 = 0;
                  for (lVar28 = 0; local_140._0_4_ != (int)lVar28; lVar28 = lVar28 + 1) {
                    fVar56 = powf(pfVar52[lVar28],pfVar54[lVar28]);
                    pfVar46[lVar28] = fVar56;
                    lVar35 = lVar35 + -4;
                  }
                  pfVar52 = (float *)((long)pfVar52 - lVar35);
                  pfVar46 = (float *)((long)pfVar46 - lVar35);
                }
                iVar41 = (int)local_128 + 1;
              }
              iVar41 = (int)local_108 + 1;
            }
            uVar31 = local_80._0_8_ + 1;
          }
          return 0;
        case 7:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar31 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar53 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              puVar49 = (undefined4 *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar92._4_4_ = uVar2;
                  auVar92._0_4_ = uVar2;
                  auVar92._8_4_ = uVar2;
                  auVar92._12_4_ = uVar2;
                  auVar92._16_4_ = uVar2;
                  auVar92._20_4_ = uVar2;
                  auVar92._24_4_ = uVar2;
                  auVar92._28_4_ = uVar2;
                  auVar3 = vsubps_avx(auVar92,*pauVar47);
                  *pauVar53 = auVar3;
                  pauVar47 = pauVar47 + 1;
                  puVar49 = puVar49 + 1;
                  pauVar53 = pauVar53 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  uVar2 = *puVar49;
                  auVar65._4_4_ = uVar2;
                  auVar65._0_4_ = uVar2;
                  auVar65._8_4_ = uVar2;
                  auVar65._12_4_ = uVar2;
                  auVar86 = vsubps_avx(auVar65,*(undefined1 (*) [16])*pauVar47);
                  *(undefined1 (*) [16])*pauVar53 = auVar86;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                  puVar49 = puVar49 + 1;
                  pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar53 + lVar35 * 4) =
                       (float)puVar49[lVar35] - *(float *)(*pauVar47 + lVar35 * 4);
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                puVar49 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35);
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar96._4_4_ = uVar2;
                    auVar96._0_4_ = uVar2;
                    auVar96._8_4_ = uVar2;
                    auVar96._12_4_ = uVar2;
                    auVar96._16_4_ = uVar2;
                    auVar96._20_4_ = uVar2;
                    auVar96._24_4_ = uVar2;
                    auVar96._28_4_ = uVar2;
                    auVar3 = vsubps_avx(auVar96,*pauVar47);
                    *pauVar53 = auVar3;
                    pauVar47 = pauVar47 + 1;
                    puVar49 = puVar49 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    uVar2 = *puVar49;
                    auVar75._4_4_ = uVar2;
                    auVar75._0_4_ = uVar2;
                    auVar75._8_4_ = uVar2;
                    auVar75._12_4_ = uVar2;
                    auVar86 = vsubps_avx(auVar75,*(undefined1 (*) [16])*pauVar47);
                    *(undefined1 (*) [16])*pauVar53 = auVar86;
                    pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                    puVar49 = puVar49 + 1;
                    pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar53 + lVar35 * 4) =
                         (float)puVar49[lVar35] - *(float *)(*pauVar47 + lVar35 * 4);
                    lVar28 = lVar28 + -4;
                  }
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                  pauVar53 = (undefined1 (*) [32])((long)pauVar53 - lVar28);
                }
              }
            }
          }
          return 0;
        case 8:
          iVar36 = local_170->elempack;
          uVar32 = local_170->h;
          iVar41 = local_170->d;
          uVar45 = local_170->c;
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            uVar39 = 0;
            if (0 < (int)uVar32) {
              uVar39 = (ulong)uVar32;
            }
            for (; uVar31 != uVar39; uVar31 = uVar31 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar31 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar53 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar31 * this_00->elemsize + (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar48 = uVar42;
              if (iVar36 == 8) {
                while ((int)uVar48 != 0) {
                  auVar3 = *pauVar47;
                  auVar87 = vrcpps_avx(auVar3);
                  fVar56 = *pfVar46;
                  auVar139._4_4_ = fVar56;
                  auVar139._0_4_ = fVar56;
                  auVar139._8_4_ = fVar56;
                  auVar139._12_4_ = fVar56;
                  auVar139._16_4_ = fVar56;
                  auVar139._20_4_ = fVar56;
                  auVar139._24_4_ = fVar56;
                  auVar139._28_4_ = fVar56;
                  fVar146 = fVar56 * auVar87._0_4_;
                  fVar147 = fVar56 * auVar87._4_4_;
                  fVar148 = fVar56 * auVar87._8_4_;
                  fVar142 = fVar56 * auVar87._12_4_;
                  fVar143 = fVar56 * auVar87._16_4_;
                  fVar144 = fVar56 * auVar87._20_4_;
                  fVar56 = fVar56 * auVar87._24_4_;
                  auVar13._4_4_ = auVar3._4_4_ * fVar147;
                  auVar13._0_4_ = auVar3._0_4_ * fVar146;
                  auVar13._8_4_ = auVar3._8_4_ * fVar148;
                  auVar13._12_4_ = auVar3._12_4_ * fVar142;
                  auVar13._16_4_ = auVar3._16_4_ * fVar143;
                  auVar13._20_4_ = auVar3._20_4_ * fVar144;
                  auVar13._24_4_ = auVar3._24_4_ * fVar56;
                  auVar13._28_4_ = auVar3._28_4_;
                  auVar3 = vsubps_avx(auVar139,auVar13);
                  auVar94._0_4_ = fVar146 + auVar87._0_4_ * auVar3._0_4_;
                  auVar94._4_4_ = fVar147 + auVar87._4_4_ * auVar3._4_4_;
                  auVar94._8_4_ = fVar148 + auVar87._8_4_ * auVar3._8_4_;
                  auVar94._12_4_ = fVar142 + auVar87._12_4_ * auVar3._12_4_;
                  auVar94._16_4_ = fVar143 + auVar87._16_4_ * auVar3._16_4_;
                  auVar94._20_4_ = fVar144 + auVar87._20_4_ * auVar3._20_4_;
                  auVar94._24_4_ = fVar56 + auVar87._24_4_ * auVar3._24_4_;
                  auVar94._28_4_ = in_register_000012dc + auVar3._28_4_;
                  *pauVar53 = auVar94;
                  pauVar47 = pauVar47 + 1;
                  pfVar46 = pfVar46 + 1;
                  pauVar53 = pauVar53 + 1;
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              uVar48 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar48 != 0) {
                  auVar86 = *(undefined1 (*) [16])*pauVar47;
                  auVar57 = vrcpps_avx(auVar86);
                  fVar56 = *pfVar46;
                  auVar135._4_4_ = fVar56;
                  auVar135._0_4_ = fVar56;
                  auVar135._8_4_ = fVar56;
                  auVar135._12_4_ = fVar56;
                  fVar146 = fVar56 * auVar57._0_4_;
                  fVar147 = fVar56 * auVar57._4_4_;
                  fVar148 = fVar56 * auVar57._8_4_;
                  fVar56 = fVar56 * auVar57._12_4_;
                  in_register_000012dc = 0.0;
                  auVar68._0_4_ = auVar86._0_4_ * fVar146;
                  auVar68._4_4_ = auVar86._4_4_ * fVar147;
                  auVar68._8_4_ = auVar86._8_4_ * fVar148;
                  auVar68._12_4_ = auVar86._12_4_ * fVar56;
                  auVar86 = vsubps_avx(auVar135,auVar68);
                  auVar69._0_4_ = fVar146 + auVar57._0_4_ * auVar86._0_4_;
                  auVar69._4_4_ = fVar147 + auVar57._4_4_ * auVar86._4_4_;
                  auVar69._8_4_ = fVar148 + auVar57._8_4_ * auVar86._8_4_;
                  auVar69._12_4_ = fVar56 + auVar57._12_4_ * auVar86._12_4_;
                  *(undefined1 (*) [16])*pauVar53 = auVar69;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                  pfVar46 = pfVar46 + 1;
                  pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                  uVar48 = (ulong)((int)uVar48 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  *(float *)((long)*pauVar53 + lVar35 * 4) =
                       pfVar46[lVar35] / *(float *)(*pauVar47 + lVar35 * 4);
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          if ((int)uVar34 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if (iVar41 < 1) {
            iVar41 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar41; iVar27 = iVar27 + 1) {
              iVar26 = local_160->d + -1;
              if (iVar27 <= iVar26) {
                iVar26 = iVar27;
              }
              for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
                uVar45 = local_160->h - 1;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar45 = uVar34;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar46 = (float *)((long)local_160->data +
                                   (int)uVar45 * lVar35 + (long)local_160->h * (long)iVar26 * lVar35
                                   );
                uVar39 = local_140._0_8_;
                if (iVar36 == 8) {
                  while ((int)uVar39 != 0) {
                    auVar3 = *pauVar47;
                    auVar87 = vrcpps_avx(auVar3);
                    fVar56 = *pfVar46;
                    auVar140._4_4_ = fVar56;
                    auVar140._0_4_ = fVar56;
                    auVar140._8_4_ = fVar56;
                    auVar140._12_4_ = fVar56;
                    auVar140._16_4_ = fVar56;
                    auVar140._20_4_ = fVar56;
                    auVar140._24_4_ = fVar56;
                    auVar140._28_4_ = fVar56;
                    fVar146 = fVar56 * auVar87._0_4_;
                    fVar147 = fVar56 * auVar87._4_4_;
                    fVar148 = fVar56 * auVar87._8_4_;
                    fVar142 = fVar56 * auVar87._12_4_;
                    fVar143 = fVar56 * auVar87._16_4_;
                    fVar144 = fVar56 * auVar87._20_4_;
                    fVar56 = fVar56 * auVar87._24_4_;
                    auVar19._4_4_ = auVar3._4_4_ * fVar147;
                    auVar19._0_4_ = auVar3._0_4_ * fVar146;
                    auVar19._8_4_ = auVar3._8_4_ * fVar148;
                    auVar19._12_4_ = auVar3._12_4_ * fVar142;
                    auVar19._16_4_ = auVar3._16_4_ * fVar143;
                    auVar19._20_4_ = auVar3._20_4_ * fVar144;
                    auVar19._24_4_ = auVar3._24_4_ * fVar56;
                    auVar19._28_4_ = auVar3._28_4_;
                    auVar3 = vsubps_avx(auVar140,auVar19);
                    auVar99._0_4_ = fVar146 + auVar87._0_4_ * auVar3._0_4_;
                    auVar99._4_4_ = fVar147 + auVar87._4_4_ * auVar3._4_4_;
                    auVar99._8_4_ = fVar148 + auVar87._8_4_ * auVar3._8_4_;
                    auVar99._12_4_ = fVar142 + auVar87._12_4_ * auVar3._12_4_;
                    auVar99._16_4_ = fVar143 + auVar87._16_4_ * auVar3._16_4_;
                    auVar99._20_4_ = fVar144 + auVar87._20_4_ * auVar3._20_4_;
                    auVar99._24_4_ = fVar56 + auVar87._24_4_ * auVar3._24_4_;
                    auVar99._28_4_ = in_register_000012dc + auVar3._28_4_;
                    *pauVar53 = auVar99;
                    pauVar47 = pauVar47 + 1;
                    pfVar46 = pfVar46 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                uVar39 = local_140._0_8_;
                if (iVar36 == 4) {
                  while ((int)uVar39 != 0) {
                    auVar86 = *(undefined1 (*) [16])*pauVar47;
                    auVar57 = vrcpps_avx(auVar86);
                    fVar56 = *pfVar46;
                    auVar136._4_4_ = fVar56;
                    auVar136._0_4_ = fVar56;
                    auVar136._8_4_ = fVar56;
                    auVar136._12_4_ = fVar56;
                    fVar146 = fVar56 * auVar57._0_4_;
                    fVar147 = fVar56 * auVar57._4_4_;
                    fVar148 = fVar56 * auVar57._8_4_;
                    fVar56 = fVar56 * auVar57._12_4_;
                    in_register_000012dc = 0.0;
                    auVar79._0_4_ = auVar86._0_4_ * fVar146;
                    auVar79._4_4_ = auVar86._4_4_ * fVar147;
                    auVar79._8_4_ = auVar86._8_4_ * fVar148;
                    auVar79._12_4_ = auVar86._12_4_ * fVar56;
                    auVar86 = vsubps_avx(auVar136,auVar79);
                    auVar80._0_4_ = fVar146 + auVar57._0_4_ * auVar86._0_4_;
                    auVar80._4_4_ = fVar147 + auVar57._4_4_ * auVar86._4_4_;
                    auVar80._8_4_ = fVar148 + auVar57._8_4_ * auVar86._8_4_;
                    auVar80._12_4_ = fVar56 + auVar57._12_4_ * auVar86._12_4_;
                    *(undefined1 (*) [16])*pauVar53 = auVar80;
                    pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
                    pfVar46 = pfVar46 + 1;
                    pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
                    uVar39 = (ulong)((int)uVar39 - 1);
                  }
                }
                if (iVar36 == 1) {
                  lVar28 = 0;
                  for (lVar35 = 0; (int)local_140._0_8_ != (int)lVar35; lVar35 = lVar35 + 1) {
                    *(float *)((long)*pauVar53 + lVar35 * 4) =
                         pfVar46[lVar35] / *(float *)(*pauVar47 + lVar35 * 4);
                    lVar28 = lVar28 + -4;
                  }
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar28);
                  pauVar53 = (undefined1 (*) [32])((long)pauVar53 - lVar28);
                }
              }
            }
          }
          return 0;
        case 9:
          iVar36 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar30 == 2) {
            uVar31 = 0;
            uVar42 = 0;
            if (0 < (int)uVar34) {
              uVar42 = local_140._0_8_;
            }
            local_118 = (float *)0x0;
            if (0 < (int)(uint)local_120) {
              local_118 = (float *)(ulong)(uint)local_120;
            }
            while ((float *)uVar31 != local_118) {
              pfVar54 = (float *)((long)local_170->w * uVar31 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar52 = (float *)((long)this_00->w * uVar31 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              uVar39 = uVar42;
              local_128 = (float *)uVar31;
              if (iVar36 == 8) {
                while ((int)uVar39 != 0) {
                  local_c0 = *(float (*) [2])pfVar54;
                  afStack_b8 = *(float (*) [2])(pfVar54 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar54 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar54 + 6);
                  fVar56 = *pfVar46;
                  local_100[1] = fVar56;
                  local_100[0] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  local_100[4] = fVar56;
                  local_100[5] = fVar56;
                  local_100[6] = fVar56;
                  local_100[7] = fVar56;
                  afVar90 = local_100;
                  BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                            ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar52 = afVar90;
                  pfVar54 = pfVar54 + 8;
                  pfVar46 = pfVar46 + 1;
                  pfVar52 = pfVar52 + 8;
                  uVar39 = (ulong)((int)uVar39 - 1);
                }
              }
              uVar31 = uVar42;
              if (iVar36 == 4) {
                while ((int)uVar31 != 0) {
                  local_c0 = *(float (*) [2])pfVar54;
                  afStack_b8 = *(float (*) [2])(pfVar54 + 2);
                  fVar56 = *pfVar46;
                  auVar63._4_4_ = fVar56;
                  auVar63._0_4_ = fVar56;
                  auVar63._8_4_ = fVar56;
                  auVar63._12_4_ = fVar56;
                  local_100[0] = fVar56;
                  local_100[1] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  auVar116 = ZEXT856(auVar63._8_8_);
                  afVar149 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                       ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar103._0_8_ = afVar149._0_8_;
                  auVar103._8_56_ = auVar116;
                  *(undefined1 (*) [16])pfVar52 = auVar103._0_16_;
                  pfVar54 = pfVar54 + 4;
                  pfVar46 = pfVar46 + 1;
                  pfVar52 = pfVar52 + 4;
                  uVar31 = (ulong)((int)uVar31 - 1);
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)uVar42 != (int)lVar35; lVar35 = lVar35 + 1) {
                  fVar56 = powf(pfVar46[lVar35],pfVar54[lVar35]);
                  (*(__m256 *)pfVar52)[lVar35] = fVar56;
                }
              }
              uVar31 = (long)local_128 + 1;
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          uVar31 = 0;
          uVar42 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar42 = uVar31;
          }
          local_140._0_8_ = uVar42;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar42 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar42 = 0;
          }
          local_a0._0_8_ = uVar42;
          while (uVar31 != local_a0._0_8_) {
            pfVar52 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar31;
            pfVar46 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            iVar41 = 0;
            while (iVar41 != (uint)local_110) {
              iVar27 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar41);
              if (iVar41 <= iVar27) {
                iVar27 = iVar41;
              }
              local_118 = (float *)(long)iVar27;
              iVar41 = 0;
              while (iVar41 != (uint)local_120) {
                iVar27 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar41);
                if (iVar41 <= iVar27) {
                  iVar27 = iVar41;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar54 = (float *)((long)local_160->data +
                                   iVar27 * lVar35 + (long)local_160->h * (long)local_118 * lVar35);
                if (iVar36 == 8) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar52;
                    afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar52 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar52 + 6);
                    fVar56 = *pfVar54;
                    local_100[1] = fVar56;
                    local_100[0] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    local_100[4] = fVar56;
                    local_100[5] = fVar56;
                    local_100[6] = fVar56;
                    local_100[7] = fVar56;
                    afVar90 = local_100;
                    BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                              ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar46 = afVar90;
                    pfVar52 = pfVar52 + 8;
                    pfVar54 = pfVar54 + 1;
                    pfVar46 = pfVar46 + 8;
                  }
                }
                if (iVar36 == 4) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar52;
                    afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                    fVar56 = *pfVar54;
                    auVar73._4_4_ = fVar56;
                    auVar73._0_4_ = fVar56;
                    auVar73._8_4_ = fVar56;
                    auVar73._12_4_ = fVar56;
                    local_100[0] = fVar56;
                    local_100[1] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    auVar116 = ZEXT856(auVar73._8_8_);
                    afVar149 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                         ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar107._0_8_ = afVar149._0_8_;
                    auVar107._8_56_ = auVar116;
                    *(undefined1 (*) [16])pfVar46 = auVar107._0_16_;
                    pfVar52 = pfVar52 + 4;
                    pfVar54 = pfVar54 + 1;
                    pfVar46 = pfVar46 + 4;
                  }
                }
                if (iVar36 == 1) {
                  lVar35 = 0;
                  for (lVar28 = 0; local_140._0_4_ != (int)lVar28; lVar28 = lVar28 + 1) {
                    fVar56 = powf(pfVar54[lVar28],pfVar52[lVar28]);
                    pfVar46[lVar28] = fVar56;
                    lVar35 = lVar35 + -4;
                  }
                  pfVar52 = (float *)((long)pfVar52 - lVar35);
                  pfVar46 = (float *)((long)pfVar46 - lVar35);
                }
                iVar41 = (int)local_128 + 1;
              }
              iVar41 = (int)local_108 + 1;
            }
            uVar31 = local_80._0_8_ + 1;
          }
          return 0;
        case 10:
          iVar36 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar30 == 2) {
            local_118 = (float *)0x0;
            local_128 = (float *)0;
            if (0 < (int)uVar34) {
              local_128 = (float *)local_140._0_8_;
            }
            local_108 = 0;
            if (0 < (int)(uint)local_120) {
              local_108 = (size_t)(uint)local_120;
            }
            for (; local_118 != (float *)local_108; local_118 = (float *)((long)local_118 + 1)) {
              pfVar52 = (float *)((long)local_170->w * (long)local_118 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar54 = (float *)((long)this_00->w * (long)local_118 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              if (iVar36 == 8) {
                uVar42 = (ulong)local_128 & 0xffffffff;
                while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                  local_c0 = *(float (*) [2])pfVar52;
                  afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar52 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar52 + 6);
                  fVar56 = *pfVar46;
                  local_100[1] = fVar56;
                  local_100[0] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  local_100[4] = fVar56;
                  local_100[5] = fVar56;
                  local_100[6] = fVar56;
                  local_100[7] = fVar56;
                  afVar90 = local_100;
                  BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                            ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar54 = afVar90;
                  pfVar52 = pfVar52 + 8;
                  pfVar46 = pfVar46 + 1;
                  pfVar54 = pfVar54 + 8;
                }
              }
              if (iVar36 == 4) {
                uVar42 = (ulong)local_128 & 0xffffffff;
                while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                  local_c0 = *(float (*) [2])pfVar52;
                  afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                  fVar56 = *pfVar46;
                  auVar70._4_4_ = fVar56;
                  auVar70._0_4_ = fVar56;
                  auVar70._8_4_ = fVar56;
                  auVar70._12_4_ = fVar56;
                  local_100[0] = fVar56;
                  local_100[1] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  auVar116 = ZEXT856(auVar70._8_8_);
                  afVar149 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                       ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar105._0_8_ = afVar149._0_8_;
                  auVar105._8_56_ = auVar116;
                  *(undefined1 (*) [16])pfVar54 = auVar105._0_16_;
                  pfVar52 = pfVar52 + 4;
                  pfVar46 = pfVar46 + 1;
                  pfVar54 = pfVar54 + 4;
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)local_128 != (int)lVar35; lVar35 = lVar35 + 1) {
                  fVar56 = BinaryOp_x86_avx_functor::binary_op_atan2::func
                                     ((binary_op_atan2 *)local_d0,pfVar52,pfVar46);
                  (*(__m256 *)pfVar54)[lVar35] = fVar56;
                  pfVar52 = pfVar52 + 1;
                  pfVar46 = pfVar46 + 1;
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          uVar31 = 0;
          uVar42 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar42 = uVar31;
          }
          local_140._0_8_ = uVar42;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar42 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar42 = 0;
          }
          local_a0._0_8_ = uVar42;
          while (uVar31 != local_a0._0_8_) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar31;
            pfVar52 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            iVar41 = 0;
            while (iVar41 != (uint)local_110) {
              iVar27 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar41);
              if (iVar41 <= iVar27) {
                iVar27 = iVar41;
              }
              local_118 = (float *)(long)iVar27;
              iVar41 = 0;
              while (iVar41 != (uint)local_120) {
                iVar27 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar41);
                if (iVar41 <= iVar27) {
                  iVar27 = iVar41;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar54 = (float *)((long)local_160->data +
                                   iVar27 * lVar35 + (long)local_160->h * (long)local_118 * lVar35);
                if (iVar36 == 8) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar46;
                    afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                    fVar56 = *pfVar54;
                    local_100[1] = fVar56;
                    local_100[0] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    local_100[4] = fVar56;
                    local_100[5] = fVar56;
                    local_100[6] = fVar56;
                    local_100[7] = fVar56;
                    afVar90 = local_100;
                    BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                              ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar52 = afVar90;
                    pfVar46 = pfVar46 + 8;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 8;
                  }
                }
                if (iVar36 == 4) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar46;
                    afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                    fVar56 = *pfVar54;
                    auVar81._4_4_ = fVar56;
                    auVar81._0_4_ = fVar56;
                    auVar81._8_4_ = fVar56;
                    auVar81._12_4_ = fVar56;
                    local_100[0] = fVar56;
                    local_100[1] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    auVar116 = ZEXT856(auVar81._8_8_);
                    afVar149 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                         ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar109._0_8_ = afVar149._0_8_;
                    auVar109._8_56_ = auVar116;
                    *(undefined1 (*) [16])pfVar52 = auVar109._0_16_;
                    pfVar46 = pfVar46 + 4;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 4;
                  }
                }
                if (iVar36 == 1) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    fVar56 = BinaryOp_x86_avx_functor::binary_op_atan2::func
                                       ((binary_op_atan2 *)local_d0,pfVar46,pfVar54);
                    *pfVar52 = fVar56;
                    pfVar46 = pfVar46 + 1;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 1;
                  }
                }
                iVar41 = (int)local_128 + 1;
              }
              iVar41 = (int)local_108 + 1;
            }
            uVar31 = local_80._0_8_ + 1;
          }
          return 0;
        case 0xb:
          iVar36 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar30 == 2) {
            local_118 = (float *)0x0;
            local_128 = (float *)0;
            if (0 < (int)uVar34) {
              local_128 = (float *)local_140._0_8_;
            }
            local_108 = 0;
            if (0 < (int)(uint)local_120) {
              local_108 = (size_t)(uint)local_120;
            }
            for (; local_118 != (float *)local_108; local_118 = (float *)((long)local_118 + 1)) {
              pfVar52 = (float *)((long)local_170->w * (long)local_118 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar54 = (float *)((long)this_00->w * (long)local_118 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar46 = (float *)local_160->data;
              if (iVar36 == 8) {
                uVar42 = (ulong)local_128 & 0xffffffff;
                while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                  local_c0 = *(float (*) [2])pfVar52;
                  afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar52 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar52 + 6);
                  fVar56 = *pfVar46;
                  local_100[1] = fVar56;
                  local_100[0] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  local_100[4] = fVar56;
                  local_100[5] = fVar56;
                  local_100[6] = fVar56;
                  local_100[7] = fVar56;
                  afVar90 = local_100;
                  BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                            (local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar54 = afVar90;
                  pfVar52 = pfVar52 + 8;
                  pfVar46 = pfVar46 + 1;
                  pfVar54 = pfVar54 + 8;
                }
              }
              if (iVar36 == 4) {
                uVar42 = (ulong)local_128 & 0xffffffff;
                while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                  local_c0 = *(float (*) [2])pfVar52;
                  afStack_b8 = *(float (*) [2])(pfVar52 + 2);
                  fVar56 = *pfVar46;
                  auVar61._4_4_ = fVar56;
                  auVar61._0_4_ = fVar56;
                  auVar61._8_4_ = fVar56;
                  auVar61._12_4_ = fVar56;
                  local_100[0] = fVar56;
                  local_100[1] = fVar56;
                  local_100[2] = fVar56;
                  local_100[3] = fVar56;
                  auVar116 = ZEXT856(auVar61._8_8_);
                  afVar149 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                       (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                  auVar102._0_8_ = afVar149._0_8_;
                  auVar102._8_56_ = auVar116;
                  *(undefined1 (*) [16])pfVar54 = auVar102._0_16_;
                  pfVar52 = pfVar52 + 4;
                  pfVar46 = pfVar46 + 1;
                  pfVar54 = pfVar54 + 4;
                }
              }
              if (iVar36 == 1) {
                for (lVar35 = 0; (int)local_128 != (int)lVar35; lVar35 = lVar35 + 1) {
                  fVar56 = BinaryOp_x86_avx_functor::binary_op_ratan2::func
                                     (local_d0,pfVar52,pfVar46);
                  (*(__m256 *)pfVar54)[lVar35] = fVar56;
                  pfVar52 = pfVar52 + 1;
                  pfVar46 = pfVar46 + 1;
                }
              }
            }
            uVar30 = local_170->dims;
          }
          if (1 < uVar30 - 3) {
            return 0;
          }
          uVar31 = 0;
          uVar42 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar42 = uVar31;
          }
          local_140._0_8_ = uVar42;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar42 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar42 = 0;
          }
          local_a0._0_8_ = uVar42;
          while (uVar31 != local_a0._0_8_) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar31;
            pfVar52 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            iVar41 = 0;
            while (iVar41 != (uint)local_110) {
              iVar27 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar41);
              if (iVar41 <= iVar27) {
                iVar27 = iVar41;
              }
              local_118 = (float *)(long)iVar27;
              iVar41 = 0;
              while (iVar41 != (uint)local_120) {
                iVar27 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar41);
                if (iVar41 <= iVar27) {
                  iVar27 = iVar41;
                }
                lVar35 = (long)local_160->w * local_160->elemsize;
                pfVar54 = (float *)((long)local_160->data +
                                   iVar27 * lVar35 + (long)local_160->h * (long)local_118 * lVar35);
                if (iVar36 == 8) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar46;
                    afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                    fVar56 = *pfVar54;
                    local_100[1] = fVar56;
                    local_100[0] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    local_100[4] = fVar56;
                    local_100[5] = fVar56;
                    local_100[6] = fVar56;
                    local_100[7] = fVar56;
                    afVar90 = local_100;
                    BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                              (local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar52 = afVar90;
                    pfVar46 = pfVar46 + 8;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 8;
                  }
                }
                if (iVar36 == 4) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    local_c0 = *(float (*) [2])pfVar46;
                    afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                    fVar56 = *pfVar54;
                    auVar71._4_4_ = fVar56;
                    auVar71._0_4_ = fVar56;
                    auVar71._8_4_ = fVar56;
                    auVar71._12_4_ = fVar56;
                    local_100[0] = fVar56;
                    local_100[1] = fVar56;
                    local_100[2] = fVar56;
                    local_100[3] = fVar56;
                    auVar116 = ZEXT856(auVar71._8_8_);
                    afVar149 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                         (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                    auVar106._0_8_ = afVar149._0_8_;
                    auVar106._8_56_ = auVar116;
                    *(undefined1 (*) [16])pfVar52 = auVar106._0_16_;
                    pfVar46 = pfVar46 + 4;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 4;
                  }
                }
                if (iVar36 == 1) {
                  uVar42 = local_140._0_8_ & 0xffffffff;
                  while (iVar41 = (int)uVar42, uVar42 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    fVar56 = BinaryOp_x86_avx_functor::binary_op_ratan2::func
                                       (local_d0,pfVar46,pfVar54);
                    *pfVar52 = fVar56;
                    pfVar46 = pfVar46 + 1;
                    pfVar54 = pfVar54 + 1;
                    pfVar52 = pfVar52 + 1;
                  }
                }
                iVar41 = (int)local_128 + 1;
              }
              iVar41 = (int)local_108 + 1;
            }
            uVar31 = local_80._0_8_ + 1;
          }
          return 0;
        }
      }
      else if ((bVar24 && uVar4 == 3) && (iVar41 == 1)) {
        if (local_170->w != uVar34) {
          return 0;
        }
        if (local_170->c != uVar45) {
          return 0;
        }
        switch(uVar32) {
        case 0:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pfVar52 = (float *)((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pfVar54 = pfVar46;
              pauVar53 = pauVar47;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar89._0_4_ = *pfVar52 + *pfVar54;
                auVar89._4_4_ = pfVar52[1] + pfVar54[1];
                auVar89._8_4_ = pfVar52[2] + pfVar54[2];
                auVar89._12_4_ = pfVar52[3] + pfVar54[3];
                auVar89._16_4_ = pfVar52[4] + pfVar54[4];
                auVar89._20_4_ = pfVar52[5] + pfVar54[5];
                auVar89._24_4_ = pfVar52[6] + pfVar54[6];
                auVar89._28_4_ = pfVar52[7] + pfVar54[7];
                *pauVar53 = auVar89;
                pfVar54 = pfVar54 + 8;
                pfVar52 = pfVar52 + 8;
                pauVar53 = pauVar53 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                pfVar52 = (float *)((long)pvVar6 + lVar29 + lVar35);
                pfVar54 = (float *)((long)pfVar46 + lVar29);
                auVar60._0_4_ = *pfVar52 + *pfVar54;
                auVar60._4_4_ = pfVar52[1] + pfVar54[1];
                auVar60._8_4_ = pfVar52[2] + pfVar54[2];
                auVar60._12_4_ = pfVar52[3] + pfVar54[3];
                *(undefined1 (*) [16])((long)*pauVar47 + lVar29) = auVar60;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar29);
              pfVar46 = (float *)((long)pfVar46 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar47 = *(float *)((long)pvVar6 + lVar28 * 4 + lVar35) + *pfVar46;
                pfVar46 = pfVar46 + 1;
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 1:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = vsubps_avx(*pauVar43,*pauVar50);
                *pauVar55 = auVar3;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = vsubps_avx(*(undefined1 (*) [16])(*pauVar47 + lVar29),
                                     *(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35));
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar86;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar53 =
                     *(float *)*pauVar47 - *(float *)((long)pvVar6 + lVar28 * 4 + lVar35);
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 2:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar31 * local_170->elemsize +
                               (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pfVar52 = (float *)((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pfVar54 = pfVar46;
              pauVar53 = pauVar47;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar20._4_4_ = pfVar52[1] * pfVar54[1];
                auVar20._0_4_ = *pfVar52 * *pfVar54;
                auVar20._8_4_ = pfVar52[2] * pfVar54[2];
                auVar20._12_4_ = pfVar52[3] * pfVar54[3];
                auVar20._16_4_ = pfVar52[4] * pfVar54[4];
                auVar20._20_4_ = pfVar52[5] * pfVar54[5];
                auVar20._24_4_ = pfVar52[6] * pfVar54[6];
                auVar20._28_4_ = pfVar52[7];
                *pauVar53 = auVar20;
                pfVar54 = pfVar54 + 8;
                pfVar52 = pfVar52 + 8;
                pauVar53 = pauVar53 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                pfVar52 = (float *)((long)pvVar6 + lVar29 + lVar35);
                pfVar54 = (float *)((long)pfVar46 + lVar29);
                auVar82._0_4_ = *pfVar52 * *pfVar54;
                auVar82._4_4_ = pfVar52[1] * pfVar54[1];
                auVar82._8_4_ = pfVar52[2] * pfVar54[2];
                auVar82._12_4_ = pfVar52[3] * pfVar54[3];
                *(undefined1 (*) [16])((long)*pauVar47 + lVar29) = auVar82;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar29);
              pfVar46 = (float *)((long)pfVar46 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar47 = *(float *)((long)pvVar6 + lVar28 * 4 + lVar35) * *pfVar46;
                pfVar46 = pfVar46 + 1;
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 3:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = *pauVar43;
                auVar87 = *pauVar50;
                auVar13 = vrcpps_avx(auVar87);
                fVar56 = auVar3._0_4_ * auVar13._0_4_;
                fVar146 = auVar3._4_4_ * auVar13._4_4_;
                fVar147 = auVar3._8_4_ * auVar13._8_4_;
                fVar148 = auVar3._12_4_ * auVar13._12_4_;
                fVar142 = auVar3._16_4_ * auVar13._16_4_;
                fVar143 = auVar3._20_4_ * auVar13._20_4_;
                fVar144 = auVar3._24_4_ * auVar13._24_4_;
                auVar21._4_4_ = auVar87._4_4_ * fVar146;
                auVar21._0_4_ = auVar87._0_4_ * fVar56;
                auVar21._8_4_ = auVar87._8_4_ * fVar147;
                auVar21._12_4_ = auVar87._12_4_ * fVar148;
                auVar21._16_4_ = auVar87._16_4_ * fVar142;
                auVar21._20_4_ = auVar87._20_4_ * fVar143;
                auVar21._24_4_ = auVar87._24_4_ * fVar144;
                auVar21._28_4_ = auVar87._28_4_;
                auVar3 = vsubps_avx(auVar3,auVar21);
                auVar100._0_4_ = fVar56 + auVar13._0_4_ * auVar3._0_4_;
                auVar100._4_4_ = fVar146 + auVar13._4_4_ * auVar3._4_4_;
                auVar100._8_4_ = fVar147 + auVar13._8_4_ * auVar3._8_4_;
                auVar100._12_4_ = fVar148 + auVar13._12_4_ * auVar3._12_4_;
                auVar100._16_4_ = fVar142 + auVar13._16_4_ * auVar3._16_4_;
                auVar100._20_4_ = fVar143 + auVar13._20_4_ * auVar3._20_4_;
                auVar100._24_4_ = fVar144 + auVar13._24_4_ * auVar3._24_4_;
                auVar100._28_4_ = in_register_000012dc + auVar3._28_4_;
                *pauVar55 = auVar100;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = *(undefined1 (*) [16])(*pauVar47 + lVar29);
                auVar57 = *(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35);
                auVar61 = vrcpps_avx(auVar57);
                fVar56 = auVar86._0_4_ * auVar61._0_4_;
                fVar146 = auVar86._4_4_ * auVar61._4_4_;
                fVar147 = auVar86._8_4_ * auVar61._8_4_;
                fVar148 = auVar86._12_4_ * auVar61._12_4_;
                in_register_000012dc = 0.0;
                auVar123._0_4_ = auVar57._0_4_ * fVar56;
                auVar123._4_4_ = auVar57._4_4_ * fVar146;
                auVar123._8_4_ = auVar57._8_4_ * fVar147;
                auVar123._12_4_ = auVar57._12_4_ * fVar148;
                auVar86 = vsubps_avx(auVar86,auVar123);
                auVar83._0_4_ = fVar56 + auVar61._0_4_ * auVar86._0_4_;
                auVar83._4_4_ = fVar146 + auVar61._4_4_ * auVar86._4_4_;
                auVar83._8_4_ = fVar147 + auVar61._8_4_ * auVar86._8_4_;
                auVar83._12_4_ = fVar148 + auVar61._12_4_ * auVar86._12_4_;
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar83;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar53 =
                     *(float *)*pauVar47 / *(float *)((long)pvVar6 + lVar28 * 4 + lVar35);
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 4:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = vmaxps_avx(*pauVar43,*pauVar50);
                *pauVar55 = auVar3;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar47 + lVar29),
                                     *(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35));
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar86;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                auVar86 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar28 * 4 + lVar35)),
                                     ZEXT416(*(uint *)*pauVar47));
                *(int *)*pauVar53 = auVar86._0_4_;
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 5:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = vminps_avx(*pauVar43,*pauVar50);
                *pauVar55 = auVar3;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = vminps_avx(*(undefined1 (*) [16])(*pauVar47 + lVar29),
                                     *(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35));
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar86;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                auVar86 = vminss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar28 * 4 + lVar35)),
                                     ZEXT416(*(uint *)*pauVar47));
                *(int *)*pauVar53 = auVar86._0_4_;
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 6:
          iVar36 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar34 * local_170->elempack;
          uVar42 = 0;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          local_110 = CONCAT44(local_110._4_4_,iVar36);
          local_a0._0_8_ = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            local_a0._0_8_ = uVar42;
          }
          for (; uVar42 != local_a0._0_8_; uVar42 = uVar42 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar42 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar42 * this_00->elemsize + (long)this_00->data)
            ;
            local_80._0_8_ = uVar42;
            for (iVar36 = 0; iVar36 != (uint)local_110; iVar36 = iVar36 + 1) {
              local_128 = (float *)local_160->data;
              local_108 = local_160->cstep * uVar42 * local_160->elemsize;
              pafVar44 = (__m256 *)((long)local_128 + local_108);
              lVar35 = 0;
              lVar28 = 0;
              pafVar33 = (__m256 *)local_168;
              local_118 = pfVar46;
              for (iVar41 = 0; iVar41 + 7 < (int)local_140._0_4_; iVar41 = iVar41 + 8) {
                local_c0 = *(float (*) [2])pfVar46;
                afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                local_100 = *pafVar44;
                local_120 = (void *)lVar28;
                afVar90 = local_100;
                BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                          ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar33 = afVar90;
                pfVar46 = pfVar46 + 8;
                pafVar44 = pafVar44 + 1;
                pafVar33 = pafVar33 + 1;
                lVar28 = (long)local_120 + 0x20;
                lVar35 = lVar35 + 8;
              }
              local_128 = (float *)((long)local_128 + local_108);
              for (; iVar41 + 3 < (int)local_140._0_4_; iVar41 = iVar41 + 4) {
                local_c0 = *(float (*) [2])((long)local_118 + lVar28);
                afStack_b8 = *(float (*) [2])((float *)((long)local_118 + lVar28) + 2);
                local_100._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar28);
                auVar116 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar28) + 8))
                ;
                afVar149 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                     ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar112._0_8_ = afVar149._0_8_;
                auVar112._8_56_ = auVar116;
                *(undefined1 (*) [16])((long)local_168 + lVar28) = auVar112._0_16_;
                lVar28 = lVar28 + 0x10;
                lVar35 = lVar35 + 4;
              }
              local_168 = (float *)((long)local_168 + lVar28);
              pfVar46 = (float *)((long)local_118 + lVar28);
              uVar42 = local_80._0_8_;
              for (; (int)lVar35 < (int)local_140._0_4_; lVar35 = lVar35 + 1) {
                fVar56 = powf(*pfVar46,*(float *)((long)local_128 + lVar35 * 4));
                *local_168 = fVar56;
                pfVar46 = pfVar46 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 7:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = vsubps_avx(*pauVar50,*pauVar43);
                *pauVar55 = auVar3;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35),
                                     *(undefined1 (*) [16])(*pauVar47 + lVar29));
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar86;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar53 =
                     *(float *)((long)pvVar6 + lVar28 * 4 + lVar35) - *(float *)*pauVar47;
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 8:
          iVar41 = uVar34 * local_170->elempack;
          iVar36 = local_170->h;
          if (local_170->h < 1) {
            iVar36 = 0;
          }
          uVar42 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar42 = 0;
          }
          for (uVar31 = 0; uVar31 != uVar42; uVar31 = uVar31 + 1) {
            pauVar47 = (undefined1 (*) [32])
                       (local_170->cstep * uVar31 * local_170->elemsize + (long)local_170->data);
            pauVar53 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
              pvVar6 = local_160->data;
              lVar35 = local_160->cstep * uVar31 * local_160->elemsize;
              pauVar50 = (undefined1 (*) [32])((long)pvVar6 + lVar35);
              lVar28 = 0;
              lVar29 = 0;
              pauVar43 = pauVar47;
              pauVar55 = pauVar53;
              for (iVar26 = 0; iVar26 + 7 < iVar41; iVar26 = iVar26 + 8) {
                auVar3 = *pauVar43;
                auVar13 = vrcpps_avx(auVar3);
                auVar87 = *pauVar50;
                fVar56 = auVar87._0_4_ * auVar13._0_4_;
                fVar146 = auVar87._4_4_ * auVar13._4_4_;
                fVar147 = auVar87._8_4_ * auVar13._8_4_;
                fVar148 = auVar87._12_4_ * auVar13._12_4_;
                fVar142 = auVar87._16_4_ * auVar13._16_4_;
                fVar143 = auVar87._20_4_ * auVar13._20_4_;
                fVar144 = auVar87._24_4_ * auVar13._24_4_;
                auVar22._4_4_ = auVar3._4_4_ * fVar146;
                auVar22._0_4_ = auVar3._0_4_ * fVar56;
                auVar22._8_4_ = auVar3._8_4_ * fVar147;
                auVar22._12_4_ = auVar3._12_4_ * fVar148;
                auVar22._16_4_ = auVar3._16_4_ * fVar142;
                auVar22._20_4_ = auVar3._20_4_ * fVar143;
                auVar22._24_4_ = auVar3._24_4_ * fVar144;
                auVar22._28_4_ = auVar3._28_4_;
                auVar3 = vsubps_avx(auVar87,auVar22);
                auVar101._0_4_ = fVar56 + auVar13._0_4_ * auVar3._0_4_;
                auVar101._4_4_ = fVar146 + auVar13._4_4_ * auVar3._4_4_;
                auVar101._8_4_ = fVar147 + auVar13._8_4_ * auVar3._8_4_;
                auVar101._12_4_ = fVar148 + auVar13._12_4_ * auVar3._12_4_;
                auVar101._16_4_ = fVar142 + auVar13._16_4_ * auVar3._16_4_;
                auVar101._20_4_ = fVar143 + auVar13._20_4_ * auVar3._20_4_;
                auVar101._24_4_ = fVar144 + auVar13._24_4_ * auVar3._24_4_;
                auVar101._28_4_ = in_register_000012dc + auVar3._28_4_;
                *pauVar55 = auVar101;
                pauVar43 = pauVar43 + 1;
                pauVar50 = pauVar50 + 1;
                pauVar55 = pauVar55 + 1;
                lVar29 = lVar29 + 0x20;
                lVar28 = lVar28 + 8;
              }
              for (; iVar26 + 3 < iVar41; iVar26 = iVar26 + 4) {
                auVar86 = *(undefined1 (*) [16])(*pauVar47 + lVar29);
                auVar61 = vrcpps_avx(auVar86);
                auVar57 = *(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar35);
                fVar56 = auVar57._0_4_ * auVar61._0_4_;
                fVar146 = auVar57._4_4_ * auVar61._4_4_;
                fVar147 = auVar57._8_4_ * auVar61._8_4_;
                fVar148 = auVar57._12_4_ * auVar61._12_4_;
                in_register_000012dc = 0.0;
                auVar84._0_4_ = auVar86._0_4_ * fVar56;
                auVar84._4_4_ = auVar86._4_4_ * fVar146;
                auVar84._8_4_ = auVar86._8_4_ * fVar147;
                auVar84._12_4_ = auVar86._12_4_ * fVar148;
                auVar86 = vsubps_avx(auVar57,auVar84);
                auVar85._0_4_ = fVar56 + auVar61._0_4_ * auVar86._0_4_;
                auVar85._4_4_ = fVar146 + auVar61._4_4_ * auVar86._4_4_;
                auVar85._8_4_ = fVar147 + auVar61._8_4_ * auVar86._8_4_;
                auVar85._12_4_ = fVar148 + auVar61._12_4_ * auVar86._12_4_;
                *(undefined1 (*) [16])((long)*pauVar53 + lVar29) = auVar85;
                lVar29 = lVar29 + 0x10;
                lVar28 = lVar28 + 4;
              }
              pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + lVar29);
              pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar29);
              for (; (int)lVar28 < iVar41; lVar28 = lVar28 + 1) {
                *(float *)*pauVar53 =
                     *(float *)((long)pvVar6 + lVar28 * 4 + lVar35) / *(float *)*pauVar47;
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + 4);
                pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 4);
              }
            }
          }
          return 0;
        case 9:
          iVar36 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar34 * local_170->elempack;
          uVar42 = 0;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          local_110 = CONCAT44(local_110._4_4_,iVar36);
          local_a0._0_8_ = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            local_a0._0_8_ = uVar42;
          }
          for (; uVar42 != local_a0._0_8_; uVar42 = uVar42 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar42 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar42 * this_00->elemsize + (long)this_00->data)
            ;
            local_80._0_8_ = uVar42;
            for (iVar36 = 0; iVar36 != (uint)local_110; iVar36 = iVar36 + 1) {
              local_128 = (float *)local_160->data;
              local_108 = local_160->cstep * uVar42 * local_160->elemsize;
              pafVar44 = (__m256 *)((long)local_128 + local_108);
              lVar35 = 0;
              lVar28 = 0;
              pafVar33 = (__m256 *)local_168;
              local_118 = pfVar46;
              for (iVar41 = 0; iVar41 + 7 < (int)local_140._0_4_; iVar41 = iVar41 + 8) {
                local_c0 = *(float (*) [2])pfVar46;
                afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                local_100 = *pafVar44;
                local_120 = (void *)lVar28;
                afVar90 = local_100;
                BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                          ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar33 = afVar90;
                pfVar46 = pfVar46 + 8;
                pafVar44 = pafVar44 + 1;
                pafVar33 = pafVar33 + 1;
                lVar28 = (long)local_120 + 0x20;
                lVar35 = lVar35 + 8;
              }
              local_128 = (float *)((long)local_128 + local_108);
              for (; iVar41 + 3 < (int)local_140._0_4_; iVar41 = iVar41 + 4) {
                local_c0 = *(float (*) [2])((long)local_118 + lVar28);
                afStack_b8 = *(float (*) [2])((float *)((long)local_118 + lVar28) + 2);
                local_100._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar28);
                auVar116 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar28) + 8))
                ;
                afVar149 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                     ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar111._0_8_ = afVar149._0_8_;
                auVar111._8_56_ = auVar116;
                *(undefined1 (*) [16])((long)local_168 + lVar28) = auVar111._0_16_;
                lVar28 = lVar28 + 0x10;
                lVar35 = lVar35 + 4;
              }
              local_168 = (float *)((long)local_168 + lVar28);
              pfVar46 = (float *)((long)local_118 + lVar28);
              uVar42 = local_80._0_8_;
              for (; (int)lVar35 < (int)local_140._0_4_; lVar35 = lVar35 + 1) {
                fVar56 = powf(*(float *)((long)local_128 + lVar35 * 4),*pfVar46);
                *local_168 = fVar56;
                pfVar46 = pfVar46 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 10:
          iVar36 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar34 * local_170->elempack;
          uVar42 = 0;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          local_108 = CONCAT44(local_108._4_4_,iVar36);
          local_a0._0_8_ = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            local_a0._0_8_ = uVar42;
          }
          for (; uVar42 != local_a0._0_8_; uVar42 = uVar42 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar42 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar42 * this_00->elemsize + (long)this_00->data)
            ;
            local_110 = uVar42;
            for (iVar36 = 0; iVar36 != (int)local_108; iVar36 = iVar36 + 1) {
              local_120 = local_160->data;
              local_118 = (float *)(local_160->cstep * uVar42 * local_160->elemsize);
              pafVar44 = (__m256 *)((long)local_120 + (long)local_118);
              lVar35 = 0;
              pafVar33 = (__m256 *)local_168;
              local_128 = pfVar46;
              for (iVar41 = 0; pfVar52 = local_118, pvVar6 = local_120,
                  iVar41 + 7 < (int)local_140._0_4_; iVar41 = iVar41 + 8) {
                local_c0 = *(float (*) [2])pfVar46;
                afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                local_100 = *pafVar44;
                afVar90 = local_100;
                BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                          ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar33 = afVar90;
                pfVar46 = pfVar46 + 8;
                pafVar44 = pafVar44 + 1;
                pafVar33 = pafVar33 + 1;
                lVar35 = lVar35 + 0x20;
              }
              for (; uVar42 = local_110, iVar41 + 3 < (int)local_140._0_4_; iVar41 = iVar41 + 4) {
                local_c0 = *(float (*) [2])((long)local_128 + lVar35);
                afStack_b8 = *(float (*) [2])((float *)((long)local_128 + lVar35) + 2);
                pauVar1 = (undefined1 (*) [16])((long)pvVar6 + lVar35 + (long)pfVar52);
                local_100._0_16_ = *pauVar1;
                auVar116 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar149 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                     ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar113._0_8_ = afVar149._0_8_;
                auVar113._8_56_ = auVar116;
                *(undefined1 (*) [16])((long)local_168 + lVar35) = auVar113._0_16_;
                lVar35 = lVar35 + 0x10;
              }
              local_168 = (float *)((long)local_168 + lVar35);
              pfVar52 = (float *)((long)local_120 + (long)local_118 + lVar35);
              pfVar46 = (float *)((long)local_128 + lVar35);
              for (; iVar41 < (int)local_140._0_4_; iVar41 = iVar41 + 1) {
                fVar56 = BinaryOp_x86_avx_functor::binary_op_atan2::func
                                   ((binary_op_atan2 *)local_d0,pfVar46,pfVar52);
                *local_168 = fVar56;
                pfVar46 = pfVar46 + 1;
                pfVar52 = pfVar52 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 0xb:
          iVar36 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar34 * local_170->elempack;
          uVar42 = 0;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          local_108 = CONCAT44(local_108._4_4_,iVar36);
          local_a0._0_8_ = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            local_a0._0_8_ = uVar42;
          }
          for (; uVar42 != local_a0._0_8_; uVar42 = uVar42 + 1) {
            pfVar46 = (float *)(local_170->cstep * uVar42 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar42 * this_00->elemsize + (long)this_00->data)
            ;
            local_110 = uVar42;
            for (iVar36 = 0; iVar36 != (int)local_108; iVar36 = iVar36 + 1) {
              local_120 = local_160->data;
              local_118 = (float *)(local_160->cstep * uVar42 * local_160->elemsize);
              pafVar44 = (__m256 *)((long)local_120 + (long)local_118);
              lVar35 = 0;
              pafVar33 = (__m256 *)local_168;
              local_128 = pfVar46;
              for (iVar41 = 0; pfVar52 = local_118, pvVar6 = local_120,
                  iVar41 + 7 < (int)local_140._0_4_; iVar41 = iVar41 + 8) {
                local_c0 = *(float (*) [2])pfVar46;
                afStack_b8 = *(float (*) [2])(pfVar46 + 2);
                afStack_b0 = *(float (*) [2])(pfVar46 + 4);
                afStack_a8 = *(float (*) [2])(pfVar46 + 6);
                local_100 = *pafVar44;
                afVar90 = local_100;
                BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                          (local_d0,(__m256 *)local_c0,&local_100);
                *pafVar33 = afVar90;
                pfVar46 = pfVar46 + 8;
                pafVar44 = pafVar44 + 1;
                pafVar33 = pafVar33 + 1;
                lVar35 = lVar35 + 0x20;
              }
              for (; uVar42 = local_110, iVar41 + 3 < (int)local_140._0_4_; iVar41 = iVar41 + 4) {
                local_c0 = *(float (*) [2])((long)local_128 + lVar35);
                afStack_b8 = *(float (*) [2])((float *)((long)local_128 + lVar35) + 2);
                pauVar1 = (undefined1 (*) [16])((long)pvVar6 + lVar35 + (long)pfVar52);
                local_100._0_16_ = *pauVar1;
                auVar116 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar149 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                     (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                auVar110._0_8_ = afVar149._0_8_;
                auVar110._8_56_ = auVar116;
                *(undefined1 (*) [16])((long)local_168 + lVar35) = auVar110._0_16_;
                lVar35 = lVar35 + 0x10;
              }
              local_168 = (float *)((long)local_168 + lVar35);
              pfVar52 = (float *)((long)local_120 + (long)local_118 + lVar35);
              pfVar46 = (float *)((long)local_128 + lVar35);
              for (; iVar41 < (int)local_140._0_4_; iVar41 = iVar41 + 1) {
                fVar56 = BinaryOp_x86_avx_functor::binary_op_ratan2::func(local_d0,pfVar46,pfVar52);
                *local_168 = fVar56;
                pfVar46 = pfVar46 + 1;
                pfVar52 = pfVar52 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        default:
          return 0;
        }
      }
      goto switchD_0036aedd_default;
    }
    switch(uVar32) {
    case 0:
      iVar26 = iVar26 * iVar36;
      if ((int)uVar45 < 1) {
        uVar45 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
        lVar35 = local_160->elemsize * local_160->cstep * uVar42;
        pvVar6 = local_160->data;
        lVar29 = this_00->elemsize * this_00->cstep * uVar42;
        pvVar9 = this_00->data;
        lVar28 = local_170->elemsize * local_170->cstep * uVar42;
        pvVar12 = local_170->data;
        lVar38 = 0;
        lVar40 = 0;
        for (iVar36 = 0; iVar36 + 7 < iVar26; iVar36 = iVar36 + 8) {
          pfVar46 = (float *)((long)pvVar6 + lVar40 + lVar35);
          pfVar52 = (float *)((long)pvVar12 + lVar40 + lVar28);
          auVar87._0_4_ = *pfVar46 + *pfVar52;
          auVar87._4_4_ = pfVar46[1] + pfVar52[1];
          auVar87._8_4_ = pfVar46[2] + pfVar52[2];
          auVar87._12_4_ = pfVar46[3] + pfVar52[3];
          auVar87._16_4_ = pfVar46[4] + pfVar52[4];
          auVar87._20_4_ = pfVar46[5] + pfVar52[5];
          auVar87._24_4_ = pfVar46[6] + pfVar52[6];
          auVar87._28_4_ = pfVar46[7] + pfVar52[7];
          *(undefined1 (*) [32])((long)pvVar9 + lVar40 + lVar29) = auVar87;
          lVar40 = lVar40 + 0x20;
          lVar38 = lVar38 + 8;
        }
        for (; iVar36 + 3 < iVar26; iVar36 = iVar36 + 4) {
          pfVar46 = (float *)((long)pvVar6 + lVar40 + lVar35);
          pfVar52 = (float *)((long)pvVar12 + lVar40 + lVar28);
          auVar57._0_4_ = *pfVar46 + *pfVar52;
          auVar57._4_4_ = pfVar46[1] + pfVar52[1];
          auVar57._8_4_ = pfVar46[2] + pfVar52[2];
          auVar57._12_4_ = pfVar46[3] + pfVar52[3];
          *(undefined1 (*) [16])((long)pvVar9 + lVar40 + lVar29) = auVar57;
          lVar40 = lVar40 + 0x10;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar26; lVar38 = lVar38 + 1) {
          *(float *)((long)pvVar9 + lVar38 * 4 + lVar29) =
               *(float *)((long)pvVar6 + lVar38 * 4 + lVar35) +
               *(float *)((long)pvVar12 + lVar38 * 4 + lVar28);
        }
      }
      return 0;
    case 1:
      pMVar37 = local_160;
      local_160 = local_170;
      break;
    case 2:
      iVar26 = iVar26 * iVar36;
      if ((int)uVar45 < 1) {
        uVar45 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
        lVar35 = local_160->elemsize * local_160->cstep * uVar42;
        pvVar6 = local_160->data;
        lVar29 = this_00->elemsize * this_00->cstep * uVar42;
        pvVar9 = this_00->data;
        lVar28 = local_170->elemsize * local_170->cstep * uVar42;
        pvVar12 = local_170->data;
        lVar38 = 0;
        lVar40 = 0;
        for (iVar36 = 0; iVar36 + 7 < iVar26; iVar36 = iVar36 + 8) {
          pfVar46 = (float *)((long)pvVar6 + lVar40 + lVar35);
          pfVar52 = (float *)((long)pvVar12 + lVar40 + lVar28);
          auVar3._4_4_ = pfVar46[1] * pfVar52[1];
          auVar3._0_4_ = *pfVar46 * *pfVar52;
          auVar3._8_4_ = pfVar46[2] * pfVar52[2];
          auVar3._12_4_ = pfVar46[3] * pfVar52[3];
          auVar3._16_4_ = pfVar46[4] * pfVar52[4];
          auVar3._20_4_ = pfVar46[5] * pfVar52[5];
          auVar3._24_4_ = pfVar46[6] * pfVar52[6];
          auVar3._28_4_ = pfVar46[7];
          *(undefined1 (*) [32])((long)pvVar9 + lVar40 + lVar29) = auVar3;
          lVar40 = lVar40 + 0x20;
          lVar38 = lVar38 + 8;
        }
        for (; iVar36 + 3 < iVar26; iVar36 = iVar36 + 4) {
          pfVar46 = (float *)((long)pvVar6 + lVar40 + lVar35);
          pfVar52 = (float *)((long)pvVar12 + lVar40 + lVar28);
          auVar86._0_4_ = *pfVar46 * *pfVar52;
          auVar86._4_4_ = pfVar46[1] * pfVar52[1];
          auVar86._8_4_ = pfVar46[2] * pfVar52[2];
          auVar86._12_4_ = pfVar46[3] * pfVar52[3];
          *(undefined1 (*) [16])((long)pvVar9 + lVar40 + lVar29) = auVar86;
          lVar40 = lVar40 + 0x10;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar26; lVar38 = lVar38 + 1) {
          *(float *)((long)pvVar9 + lVar38 * 4 + lVar29) =
               *(float *)((long)pvVar6 + lVar38 * 4 + lVar35) *
               *(float *)((long)pvVar12 + lVar38 * 4 + lVar28);
        }
      }
      return 0;
    case 3:
      pMVar37 = local_160;
      local_160 = local_170;
      goto LAB_0036fa82;
    case 4:
      iVar26 = iVar26 * iVar36;
      if ((int)uVar45 < 1) {
        uVar45 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
        lVar35 = local_160->elemsize * local_160->cstep * uVar42;
        pvVar6 = local_160->data;
        lVar29 = this_00->elemsize * this_00->cstep * uVar42;
        pvVar9 = this_00->data;
        lVar28 = local_170->elemsize * local_170->cstep * uVar42;
        pvVar12 = local_170->data;
        lVar38 = 0;
        lVar40 = 0;
        for (iVar36 = 0; iVar36 + 7 < iVar26; iVar36 = iVar36 + 8) {
          auVar3 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar12 + lVar40 + lVar28),
                              *(undefined1 (*) [32])((long)pvVar6 + lVar40 + lVar35));
          *(undefined1 (*) [32])((long)pvVar9 + lVar40 + lVar29) = auVar3;
          lVar40 = lVar40 + 0x20;
          lVar38 = lVar38 + 8;
        }
        for (; iVar36 + 3 < iVar26; iVar36 = iVar36 + 4) {
          auVar86 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar28),
                               *(undefined1 (*) [16])((long)pvVar6 + lVar40 + lVar35));
          *(undefined1 (*) [16])((long)pvVar9 + lVar40 + lVar29) = auVar86;
          lVar40 = lVar40 + 0x10;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar26; lVar38 = lVar38 + 1) {
          auVar86 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar38 * 4 + lVar35)),
                               ZEXT416(*(uint *)((long)pvVar12 + lVar38 * 4 + lVar28)));
          *(int *)((long)pvVar9 + lVar38 * 4 + lVar29) = auVar86._0_4_;
        }
      }
      return 0;
    case 5:
      iVar26 = iVar26 * iVar36;
      if ((int)uVar45 < 1) {
        uVar45 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
        lVar35 = local_160->elemsize * local_160->cstep * uVar42;
        pvVar6 = local_160->data;
        lVar29 = this_00->elemsize * this_00->cstep * uVar42;
        pvVar9 = this_00->data;
        lVar28 = local_170->elemsize * local_170->cstep * uVar42;
        pvVar12 = local_170->data;
        lVar38 = 0;
        lVar40 = 0;
        for (iVar36 = 0; iVar36 + 7 < iVar26; iVar36 = iVar36 + 8) {
          auVar3 = vminps_avx(*(undefined1 (*) [32])((long)pvVar12 + lVar40 + lVar28),
                              *(undefined1 (*) [32])((long)pvVar6 + lVar40 + lVar35));
          *(undefined1 (*) [32])((long)pvVar9 + lVar40 + lVar29) = auVar3;
          lVar40 = lVar40 + 0x20;
          lVar38 = lVar38 + 8;
        }
        for (; iVar36 + 3 < iVar26; iVar36 = iVar36 + 4) {
          auVar86 = vminps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar40 + lVar28),
                               *(undefined1 (*) [16])((long)pvVar6 + lVar40 + lVar35));
          *(undefined1 (*) [16])((long)pvVar9 + lVar40 + lVar29) = auVar86;
          lVar40 = lVar40 + 0x10;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar26; lVar38 = lVar38 + 1) {
          auVar86 = vminss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar38 * 4 + lVar35)),
                               ZEXT416(*(uint *)((long)pvVar12 + lVar38 * 4 + lVar28)));
          *(int *)((long)pvVar9 + lVar38 * 4 + lVar29) = auVar86._0_4_;
        }
      }
      return 0;
    case 6:
      pMVar37 = local_160;
      local_160 = local_170;
      goto LAB_0036fa60;
    case 7:
      pMVar37 = local_170;
      break;
    case 8:
      pMVar37 = local_170;
LAB_0036fa82:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
                (local_160,pMVar37,this_00,(Option *)&switchD_0036aedd::switchdataD_004f45b4);
      return 0;
    case 9:
      pMVar37 = local_170;
LAB_0036fa60:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                (local_160,pMVar37,this_00,(Option *)&switchD_0036aedd::switchdataD_004f45b4);
      return 0;
    case 10:
      pMVar37 = local_160;
      local_160 = local_170;
      goto LAB_0036faa4;
    case 0xb:
      pMVar37 = local_170;
LAB_0036faa4:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
                (local_160,pMVar37,this_00,(Option *)&switchD_0036aedd::switchdataD_004f45b4);
      return 0;
    default:
      goto switchD_0036aedd_default;
    }
    binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
              (local_160,pMVar37,this_00,(Option *)&switchD_0036aedd::switchdataD_004f45b4);
    return 0;
  }
  if (0xb < uVar32) goto switchD_0036aedd_default;
  fVar56 = *local_160->data;
  local_140 = ZEXT416((uint)fVar56);
  auVar86 = ZEXT416((uint)fVar56);
  auVar57 = ZEXT416((uint)fVar56);
  switch(uVar32) {
  case 0:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar57,auVar86,0);
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pfVar46 = (float *)(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      iVar41 = 0;
      while( true ) {
        fVar146 = auVar86._0_4_;
        fVar147 = auVar86._4_4_;
        fVar148 = auVar86._8_4_;
        fVar142 = auVar86._12_4_;
        if (iVar36 <= iVar41 + 7) break;
        auVar137._0_4_ = fVar146 + *pfVar46;
        auVar137._4_4_ = fVar147 + pfVar46[1];
        auVar137._8_4_ = fVar148 + pfVar46[2];
        auVar137._12_4_ = fVar142 + pfVar46[3];
        auVar137._16_4_ = fVar146 + pfVar46[4];
        auVar137._20_4_ = fVar147 + pfVar46[5];
        auVar137._24_4_ = fVar148 + pfVar46[6];
        auVar137._28_4_ = fVar142 + pfVar46[7];
        *pauVar47 = auVar137;
        pfVar46 = pfVar46 + 8;
        pauVar47 = pauVar47 + 1;
        iVar41 = iVar41 + 8;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar131._0_4_ = fVar146 + *pfVar46;
        auVar131._4_4_ = fVar147 + pfVar46[1];
        auVar131._8_4_ = fVar148 + pfVar46[2];
        auVar131._12_4_ = fVar142 + pfVar46[3];
        *(undefined1 (*) [16])*pauVar47 = auVar131;
        pfVar46 = pfVar46 + 4;
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) =
             fVar56 + *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42);
      }
    }
    break;
  case 1:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar57,0);
    auVar126._16_16_ = auVar86;
    auVar126._0_16_ = auVar86;
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar53 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        auVar3 = vsubps_avx(*pauVar47,auVar126);
        *pauVar53 = auVar3;
        pauVar47 = pauVar47 + 1;
        pauVar53 = pauVar53 + 1;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar57 = vsubps_avx(*(undefined1 (*) [16])*pauVar47,auVar86);
        *(undefined1 (*) [16])*pauVar53 = auVar57;
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) =
             *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42) - fVar56;
      }
    }
    break;
  case 2:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pfVar46 = (float *)(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      iVar41 = 0;
      while( true ) {
        fVar146 = auVar86._0_4_;
        fVar147 = auVar86._4_4_;
        fVar148 = auVar86._8_4_;
        if (iVar36 <= iVar41 + 7) break;
        auVar141._0_4_ = fVar146 * *pfVar46;
        auVar141._4_4_ = fVar147 * pfVar46[1];
        auVar141._8_4_ = fVar148 * pfVar46[2];
        auVar141._12_4_ = auVar86._12_4_ * pfVar46[3];
        auVar141._16_4_ = fVar146 * pfVar46[4];
        auVar141._20_4_ = fVar147 * pfVar46[5];
        auVar141._28_36_ = in_ZMM2._28_36_;
        auVar141._24_4_ = fVar148 * pfVar46[6];
        in_ZMM2 = ZEXT3264(auVar141._0_32_);
        *pauVar47 = auVar141._0_32_;
        pfVar46 = pfVar46 + 8;
        pauVar47 = pauVar47 + 1;
        iVar41 = iVar41 + 8;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar132._0_4_ = fVar146 * *pfVar46;
        auVar132._4_4_ = fVar147 * pfVar46[1];
        auVar132._8_4_ = fVar148 * pfVar46[2];
        auVar132._12_4_ = auVar86._12_4_ * pfVar46[3];
        in_ZMM2 = ZEXT1664(auVar132);
        *(undefined1 (*) [16])*pauVar47 = auVar132;
        pfVar46 = pfVar46 + 4;
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        fVar146 = fVar56 * *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42);
        in_ZMM2 = ZEXT464((uint)fVar146);
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) = fVar146;
      }
    }
    break;
  case 3:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar59._0_4_ = 1.0 / fVar56;
    auVar59._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar86 = vshufps_avx(auVar59,auVar59,0);
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pfVar46 = (float *)(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pfVar52 = (float *)(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      iVar41 = 0;
      while( true ) {
        fVar56 = auVar86._0_4_;
        fVar146 = auVar86._4_4_;
        fVar147 = auVar86._8_4_;
        if (iVar36 <= iVar41 + 7) break;
        fVar148 = pfVar46[1];
        fVar142 = pfVar46[2];
        fVar143 = pfVar46[3];
        fVar144 = pfVar46[4];
        fVar145 = pfVar46[5];
        fVar23 = pfVar46[6];
        *pfVar52 = fVar56 * *pfVar46;
        pfVar52[1] = fVar146 * fVar148;
        pfVar52[2] = fVar147 * fVar142;
        pfVar52[3] = auVar86._12_4_ * fVar143;
        pfVar52[4] = fVar56 * fVar144;
        pfVar52[5] = fVar146 * fVar145;
        pfVar52[6] = fVar147 * fVar23;
        pfVar52[7] = in_register_000012dc;
        pfVar46 = pfVar46 + 8;
        pfVar52 = pfVar52 + 8;
        iVar41 = iVar41 + 8;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        fVar148 = pfVar46[1];
        fVar142 = pfVar46[2];
        fVar143 = pfVar46[3];
        in_register_000012dc = 0.0;
        *pfVar52 = fVar56 * *pfVar46;
        pfVar52[1] = fVar146 * fVar148;
        pfVar52[2] = fVar147 * fVar142;
        pfVar52[3] = auVar86._12_4_ * fVar143;
        pfVar46 = pfVar46 + 4;
        pfVar52 = pfVar52 + 4;
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        in_register_000012dc = 0.0;
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) =
             auVar59._0_4_ * *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42);
      }
    }
    break;
  case 4:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    auVar124._16_16_ = auVar57;
    auVar124._0_16_ = auVar57;
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar53 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        auVar3 = vmaxps_avx(auVar124,*pauVar47);
        *pauVar53 = auVar3;
        pauVar47 = pauVar47 + 1;
        pauVar53 = pauVar53 + 1;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar61 = vmaxps_avx(auVar57,*(undefined1 (*) [16])*pauVar47);
        *(undefined1 (*) [16])*pauVar53 = auVar61;
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        auVar61 = vmaxss_avx(auVar86,ZEXT416(*(uint *)((long)pvVar6 +
                                                      lVar35 * 4 + sVar8 * sVar7 * uVar42)));
        *(int *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) = auVar61._0_4_;
      }
    }
    break;
  case 5:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar57,0);
    auVar127._16_16_ = auVar86;
    auVar127._0_16_ = auVar86;
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar53 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        auVar3 = vminps_avx(auVar127,*pauVar47);
        *pauVar53 = auVar3;
        pauVar47 = pauVar47 + 1;
        pauVar53 = pauVar53 + 1;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar61 = vminps_avx(auVar86,*(undefined1 (*) [16])*pauVar47);
        *(undefined1 (*) [16])*pauVar53 = auVar61;
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        auVar61 = vminss_avx(auVar57,ZEXT416(*(uint *)((long)pvVar6 +
                                                      lVar35 * 4 + sVar8 * sVar7 * uVar42)));
        *(int *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) = auVar61._0_4_;
      }
    }
    break;
  case 6:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    local_80 = ZEXT1632(auVar86);
    register0x00001210 = auVar86;
    local_a0 = auVar86;
    uVar42 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar42;
    }
    for (; auVar3 = _local_a0, uVar42 != local_110; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar46 = (float *)((long)local_120 * uVar42 * (long)local_118 + (long)pvVar6);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar7 = this_00->cstep;
      puVar51 = (undefined8 *)(sVar7 * uVar42 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar35 = 0;
      _local_a0 = auVar3;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        uVar115 = *(undefined8 *)pfVar46;
        uVar114 = *(undefined8 *)(pfVar46 + 2);
        uVar117 = *(undefined8 *)(pfVar46 + 4);
        uVar118 = *(undefined8 *)(pfVar46 + 6);
        local_100 = *(__m256 *)pfVar46;
        BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                  ((binary_op_pow *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar51 = uVar115;
        puVar51[1] = uVar114;
        puVar51[2] = uVar117;
        puVar51[3] = uVar118;
        pfVar46 = pfVar46 + 8;
        puVar51 = puVar51 + 4;
        lVar35 = lVar35 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar52 = local_128, iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar46;
        uVar115 = *(undefined8 *)(pfVar46 + 2);
        afStack_c8 = (float  [2])uVar115;
        afVar149 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                             ((binary_op_pow *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar51 = afVar149._0_8_;
        puVar51[1] = uVar115;
        pfVar46 = pfVar46 + 4;
        puVar51 = puVar51 + 2;
        lVar35 = lVar35 + 4;
      }
      lVar28 = (long)local_120 * (long)local_118;
      lVar29 = sVar7 * local_108;
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        fVar56 = powf(*(float *)((long)pvVar6 + lVar35 * 4 + lVar28 * uVar42),local_140._0_4_);
        *(float *)((long)pfVar52 + lVar35 * 4 + lVar29 * uVar42) = fVar56;
      }
    }
    goto switchD_0036aedd_default;
  case 7:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    auVar125._16_16_ = auVar86;
    auVar125._0_16_ = auVar86;
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar53 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        auVar3 = vsubps_avx(auVar125,*pauVar47);
        *pauVar53 = auVar3;
        pauVar47 = pauVar47 + 1;
        pauVar53 = pauVar53 + 1;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar57 = vsubps_avx(auVar86,*(undefined1 (*) [16])*pauVar47);
        *(undefined1 (*) [16])*pauVar53 = auVar57;
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) =
             fVar56 - *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42);
      }
    }
    break;
  case 8:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    auVar128._16_16_ = auVar86;
    auVar128._0_16_ = auVar86;
    uVar32 = local_170->c;
    if (local_170->c < 1) {
      uVar32 = 0;
    }
    for (uVar42 = 0; uVar42 != uVar32; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      sVar7 = local_170->elemsize;
      sVar8 = local_170->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar8 * uVar42 * sVar7 + (long)pvVar6);
      pvVar9 = this_00->data;
      sVar10 = this_00->elemsize;
      sVar11 = this_00->cstep;
      pauVar53 = (undefined1 (*) [32])(sVar11 * uVar42 * sVar10 + (long)pvVar9);
      lVar35 = 0;
      iVar41 = 0;
      while( true ) {
        fVar146 = auVar86._0_4_;
        fVar147 = auVar86._4_4_;
        fVar148 = auVar86._8_4_;
        if (iVar36 <= iVar41 + 7) break;
        auVar3 = *pauVar47;
        auVar87 = vrcpps_avx(auVar3);
        fVar142 = fVar146 * auVar87._0_4_;
        fVar143 = fVar147 * auVar87._4_4_;
        fVar144 = fVar148 * auVar87._8_4_;
        fVar145 = auVar86._12_4_ * auVar87._12_4_;
        fVar146 = fVar146 * auVar87._16_4_;
        fVar147 = fVar147 * auVar87._20_4_;
        fVar148 = fVar148 * auVar87._24_4_;
        auVar14._4_4_ = auVar3._4_4_ * fVar143;
        auVar14._0_4_ = auVar3._0_4_ * fVar142;
        auVar14._8_4_ = auVar3._8_4_ * fVar144;
        auVar14._12_4_ = auVar3._12_4_ * fVar145;
        auVar14._16_4_ = auVar3._16_4_ * fVar146;
        auVar14._20_4_ = auVar3._20_4_ * fVar147;
        auVar14._24_4_ = auVar3._24_4_ * fVar148;
        auVar14._28_4_ = auVar3._28_4_;
        auVar3 = vsubps_avx(auVar128,auVar14);
        auVar138._0_4_ = fVar142 + auVar87._0_4_ * auVar3._0_4_;
        auVar138._4_4_ = fVar143 + auVar87._4_4_ * auVar3._4_4_;
        auVar138._8_4_ = fVar144 + auVar87._8_4_ * auVar3._8_4_;
        auVar138._12_4_ = fVar145 + auVar87._12_4_ * auVar3._12_4_;
        auVar138._16_4_ = fVar146 + auVar87._16_4_ * auVar3._16_4_;
        auVar138._20_4_ = fVar147 + auVar87._20_4_ * auVar3._20_4_;
        auVar138._24_4_ = fVar148 + auVar87._24_4_ * auVar3._24_4_;
        auVar138._28_4_ = in_register_0000131c + auVar3._28_4_;
        *pauVar53 = auVar138;
        pauVar47 = pauVar47 + 1;
        pauVar53 = pauVar53 + 1;
        iVar41 = iVar41 + 8;
        lVar35 = lVar35 + 8;
      }
      for (; iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        auVar57 = *(undefined1 (*) [16])*pauVar47;
        auVar61 = vrcpps_avx(auVar57);
        fVar142 = fVar146 * auVar61._0_4_;
        fVar143 = fVar147 * auVar61._4_4_;
        fVar144 = fVar148 * auVar61._8_4_;
        fVar145 = auVar86._12_4_ * auVar61._12_4_;
        in_register_0000131c = 0.0;
        auVar133._0_4_ = auVar57._0_4_ * fVar142;
        auVar133._4_4_ = auVar57._4_4_ * fVar143;
        auVar133._8_4_ = auVar57._8_4_ * fVar144;
        auVar133._12_4_ = auVar57._12_4_ * fVar145;
        auVar57 = vsubps_avx(auVar86,auVar133);
        auVar134._0_4_ = fVar142 + auVar61._0_4_ * auVar57._0_4_;
        auVar134._4_4_ = fVar143 + auVar61._4_4_ * auVar57._4_4_;
        auVar134._8_4_ = fVar144 + auVar61._8_4_ * auVar57._8_4_;
        auVar134._12_4_ = fVar145 + auVar61._12_4_ * auVar57._12_4_;
        *(undefined1 (*) [16])*pauVar53 = auVar134;
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        pauVar53 = (undefined1 (*) [32])((long)*pauVar53 + 0x10);
        lVar35 = lVar35 + 4;
      }
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        *(float *)((long)pvVar9 + lVar35 * 4 + sVar11 * sVar10 * uVar42) =
             fVar56 / *(float *)((long)pvVar6 + lVar35 * 4 + sVar8 * sVar7 * uVar42);
      }
    }
    break;
  case 9:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    local_80 = ZEXT1632(auVar86);
    register0x00001210 = auVar86;
    local_a0 = auVar86;
    uVar42 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar42;
    }
    for (; auVar3 = _local_a0, uVar42 != local_110; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar46 = (float *)((long)local_120 * uVar42 * (long)local_118 + (long)pvVar6);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar7 = this_00->cstep;
      puVar51 = (undefined8 *)(sVar7 * uVar42 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar35 = 0;
      _local_a0 = auVar3;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        uVar115 = *(undefined8 *)pfVar46;
        uVar114 = *(undefined8 *)(pfVar46 + 2);
        uVar117 = *(undefined8 *)(pfVar46 + 4);
        uVar118 = *(undefined8 *)(pfVar46 + 6);
        local_100 = *(__m256 *)pfVar46;
        BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                  ((binary_op_rpow *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar51 = uVar115;
        puVar51[1] = uVar114;
        puVar51[2] = uVar117;
        puVar51[3] = uVar118;
        pfVar46 = pfVar46 + 8;
        puVar51 = puVar51 + 4;
        lVar35 = lVar35 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar52 = local_128, iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar46;
        uVar115 = *(undefined8 *)(pfVar46 + 2);
        afStack_c8 = (float  [2])uVar115;
        afVar149 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                             ((binary_op_rpow *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar51 = afVar149._0_8_;
        puVar51[1] = uVar115;
        pfVar46 = pfVar46 + 4;
        puVar51 = puVar51 + 2;
        lVar35 = lVar35 + 4;
      }
      lVar28 = (long)local_120 * (long)local_118;
      lVar29 = sVar7 * local_108;
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        fVar56 = powf((float)local_140._0_4_,*(float *)((long)pvVar6 + lVar35 * 4 + lVar28 * uVar42)
                     );
        *(float *)((long)pfVar52 + lVar35 * 4 + lVar29 * uVar42) = fVar56;
      }
    }
    goto switchD_0036aedd_default;
  case 10:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(auVar86,auVar86,0);
    local_80 = ZEXT1632(auVar86);
    register0x00001210 = auVar86;
    local_a0 = auVar86;
    uVar42 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar42;
    }
    for (; auVar3 = _local_a0, uVar42 != local_110; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar46 = (float *)((long)local_120 * uVar42 * (long)local_118 + (long)pvVar6);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar7 = this_00->cstep;
      puVar51 = (undefined8 *)(sVar7 * uVar42 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar35 = 0;
      _local_a0 = auVar3;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        uVar115 = *(undefined8 *)pfVar46;
        uVar114 = *(undefined8 *)(pfVar46 + 2);
        uVar117 = *(undefined8 *)(pfVar46 + 4);
        uVar118 = *(undefined8 *)(pfVar46 + 6);
        local_100 = *(__m256 *)pfVar46;
        BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                  ((binary_op_atan2 *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar51 = uVar115;
        puVar51[1] = uVar114;
        puVar51[2] = uVar117;
        puVar51[3] = uVar118;
        pfVar46 = pfVar46 + 8;
        puVar51 = puVar51 + 4;
        lVar35 = lVar35 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar52 = local_128, iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar46;
        uVar115 = *(undefined8 *)(pfVar46 + 2);
        afStack_c8 = (float  [2])uVar115;
        afVar149 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                             ((binary_op_atan2 *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar51 = afVar149._0_8_;
        puVar51[1] = uVar115;
        pfVar46 = pfVar46 + 4;
        puVar51 = puVar51 + 2;
        lVar35 = lVar35 + 4;
      }
      lVar28 = (long)local_120 * (long)local_118;
      lVar29 = sVar7 * local_108;
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        fVar56 = atan2f(*(float *)((long)pvVar6 + lVar35 * 4 + lVar28 * uVar42),local_140._0_4_);
        *(float *)((long)pfVar52 + lVar35 * 4 + lVar29 * uVar42) = fVar56;
      }
    }
    goto switchD_0036aedd_default;
  case 0xb:
    iVar36 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar86 = vshufps_avx(local_140,auVar86,0);
    local_80 = ZEXT1632(auVar86);
    register0x00001210 = auVar86;
    local_a0 = auVar86;
    uVar42 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar42;
    }
    for (; auVar3 = _local_a0, uVar42 != local_110; uVar42 = uVar42 + 1) {
      pvVar6 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar46 = (float *)((long)local_120 * uVar42 * (long)local_118 + (long)pvVar6);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar7 = this_00->cstep;
      puVar51 = (undefined8 *)(sVar7 * uVar42 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar35 = 0;
      _local_a0 = auVar3;
      for (iVar41 = 0; iVar41 + 7 < iVar36; iVar41 = iVar41 + 8) {
        uVar115 = *(undefined8 *)pfVar46;
        uVar114 = *(undefined8 *)(pfVar46 + 2);
        uVar117 = *(undefined8 *)(pfVar46 + 4);
        uVar118 = *(undefined8 *)(pfVar46 + 6);
        local_100 = *(__m256 *)pfVar46;
        BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                  (&local_141,&local_100,(__m256 *)local_c0);
        *puVar51 = uVar115;
        puVar51[1] = uVar114;
        puVar51[2] = uVar117;
        puVar51[3] = uVar118;
        pfVar46 = pfVar46 + 8;
        puVar51 = puVar51 + 4;
        lVar35 = lVar35 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar52 = local_128, iVar41 + 3 < iVar36; iVar41 = iVar41 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar46;
        uVar115 = *(undefined8 *)(pfVar46 + 2);
        afStack_c8 = (float  [2])uVar115;
        afVar149 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                             (&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar51 = afVar149._0_8_;
        puVar51[1] = uVar115;
        pfVar46 = pfVar46 + 4;
        puVar51 = puVar51 + 2;
        lVar35 = lVar35 + 4;
      }
      lVar28 = (long)local_120 * (long)local_118;
      lVar29 = sVar7 * local_108;
      for (; (int)lVar35 < iVar36; lVar35 = lVar35 + 1) {
        fVar56 = atan2f((float)local_140._0_4_,
                        *(float *)((long)pvVar6 + lVar35 * 4 + lVar28 * uVar42));
        *(float *)((long)pfVar52 + lVar35 * 4 + lVar29 * uVar42) = fVar56;
      }
    }
switchD_0036aedd_default:
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}